

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  byte bVar42;
  uint uVar43;
  ulong uVar44;
  long lVar46;
  uint uVar47;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar51;
  ulong uVar52;
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  int iVar110;
  float t1;
  float fVar111;
  undefined4 uVar112;
  float fVar115;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar116;
  vfloat4 a0_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  vfloat4 a0_2;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar137;
  vfloat4 a0;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  __m128 a_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  __m128 a;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar203;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar202;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar221;
  float fVar222;
  vfloat4 a0_3;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar224;
  float fVar225;
  float fVar232;
  vfloat4 b0_2;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar233;
  float fVar243;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar251;
  float fVar259;
  vfloat4 a0_4;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  int iVar265;
  undefined1 in_ZMM17 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  uint auStack_410 [4];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar45;
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar250 [32];
  
  PVar5 = prim[1];
  uVar44 = (ulong)(byte)PVar5;
  lVar48 = uVar44 * 0x25;
  fVar137 = *(float *)(prim + lVar48 + 0x12);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar73 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar74 = vsubps_avx(auVar53,*(undefined1 (*) [16])(prim + lVar48 + 6));
  fVar136 = fVar137 * auVar74._0_4_;
  fVar111 = fVar137 * auVar73._0_4_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar44 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar44 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar54);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar44 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar69);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar44 * 0xf + 6);
  auVar93 = vpmovsxbd_avx2(auVar65);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar86 = vpmovsxbd_avx2(auVar68);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vcvtdq2ps_avx(auVar86);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar44 + 6);
  auVar82 = vpmovsxbd_avx2(auVar70);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar44 * 0x1a + 6);
  auVar83 = vpmovsxbd_avx2(auVar66);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar44 * 0x1b + 6);
  auVar84 = vpmovsxbd_avx2(auVar67);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar44 * 0x1c + 6);
  auVar79 = vpmovsxbd_avx2(auVar72);
  auVar85 = vcvtdq2ps_avx(auVar79);
  auVar96._4_4_ = fVar111;
  auVar96._0_4_ = fVar111;
  auVar96._8_4_ = fVar111;
  auVar96._12_4_ = fVar111;
  auVar96._16_4_ = fVar111;
  auVar96._20_4_ = fVar111;
  auVar96._24_4_ = fVar111;
  auVar96._28_4_ = fVar111;
  auVar263._8_4_ = 1;
  auVar263._0_8_ = 0x100000001;
  auVar263._12_4_ = 1;
  auVar263._16_4_ = 1;
  auVar263._20_4_ = 1;
  auVar263._24_4_ = 1;
  auVar263._28_4_ = 1;
  auVar77 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar88 = ZEXT1632(CONCAT412(fVar137 * auVar73._12_4_,
                               CONCAT48(fVar137 * auVar73._8_4_,
                                        CONCAT44(fVar137 * auVar73._4_4_,fVar111))));
  auVar87 = vpermps_avx2(auVar263,auVar88);
  auVar78 = vpermps_avx512vl(auVar77,auVar88);
  fVar209 = auVar78._0_4_;
  fVar221 = auVar78._4_4_;
  auVar88._4_4_ = fVar221 * auVar92._4_4_;
  auVar88._0_4_ = fVar209 * auVar92._0_4_;
  fVar222 = auVar78._8_4_;
  auVar88._8_4_ = fVar222 * auVar92._8_4_;
  fVar115 = auVar78._12_4_;
  auVar88._12_4_ = fVar115 * auVar92._12_4_;
  fVar116 = auVar78._16_4_;
  auVar88._16_4_ = fVar116 * auVar92._16_4_;
  fVar223 = auVar78._20_4_;
  auVar88._20_4_ = fVar223 * auVar92._20_4_;
  fVar224 = auVar78._24_4_;
  auVar88._24_4_ = fVar224 * auVar92._24_4_;
  auVar88._28_4_ = auVar86._28_4_;
  auVar86._4_4_ = auVar82._4_4_ * fVar221;
  auVar86._0_4_ = auVar82._0_4_ * fVar209;
  auVar86._8_4_ = auVar82._8_4_ * fVar222;
  auVar86._12_4_ = auVar82._12_4_ * fVar115;
  auVar86._16_4_ = auVar82._16_4_ * fVar116;
  auVar86._20_4_ = auVar82._20_4_ * fVar223;
  auVar86._24_4_ = auVar82._24_4_ * fVar224;
  auVar86._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar85._4_4_ * fVar221;
  auVar79._0_4_ = auVar85._0_4_ * fVar209;
  auVar79._8_4_ = auVar85._8_4_ * fVar222;
  auVar79._12_4_ = auVar85._12_4_ * fVar115;
  auVar79._16_4_ = auVar85._16_4_ * fVar116;
  auVar79._20_4_ = auVar85._20_4_ * fVar223;
  auVar79._24_4_ = auVar85._24_4_ * fVar224;
  auVar79._28_4_ = auVar78._28_4_;
  auVar53 = vfmadd231ps_fma(auVar88,auVar87,auVar80);
  auVar54 = vfmadd231ps_fma(auVar86,auVar87,auVar94);
  auVar69 = vfmadd231ps_fma(auVar79,auVar84,auVar87);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar96,auVar81);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar96,auVar93);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar83,auVar96);
  auVar258._4_4_ = fVar136;
  auVar258._0_4_ = fVar136;
  auVar258._8_4_ = fVar136;
  auVar258._12_4_ = fVar136;
  auVar258._16_4_ = fVar136;
  auVar258._20_4_ = fVar136;
  auVar258._24_4_ = fVar136;
  auVar258._28_4_ = fVar136;
  auVar79 = ZEXT1632(CONCAT412(fVar137 * auVar74._12_4_,
                               CONCAT48(fVar137 * auVar74._8_4_,
                                        CONCAT44(fVar137 * auVar74._4_4_,fVar136))));
  auVar86 = vpermps_avx2(auVar263,auVar79);
  auVar79 = vpermps_avx512vl(auVar77,auVar79);
  fVar137 = auVar79._0_4_;
  fVar209 = auVar79._4_4_;
  auVar87._4_4_ = fVar209 * auVar92._4_4_;
  auVar87._0_4_ = fVar137 * auVar92._0_4_;
  fVar221 = auVar79._8_4_;
  auVar87._8_4_ = fVar221 * auVar92._8_4_;
  fVar222 = auVar79._12_4_;
  auVar87._12_4_ = fVar222 * auVar92._12_4_;
  fVar115 = auVar79._16_4_;
  auVar87._16_4_ = fVar115 * auVar92._16_4_;
  fVar116 = auVar79._20_4_;
  auVar87._20_4_ = fVar116 * auVar92._20_4_;
  fVar223 = auVar79._24_4_;
  auVar87._24_4_ = fVar223 * auVar92._24_4_;
  auVar87._28_4_ = fVar111;
  auVar77._4_4_ = auVar82._4_4_ * fVar209;
  auVar77._0_4_ = auVar82._0_4_ * fVar137;
  auVar77._8_4_ = auVar82._8_4_ * fVar221;
  auVar77._12_4_ = auVar82._12_4_ * fVar222;
  auVar77._16_4_ = auVar82._16_4_ * fVar115;
  auVar77._20_4_ = auVar82._20_4_ * fVar116;
  auVar77._24_4_ = auVar82._24_4_ * fVar223;
  auVar77._28_4_ = auVar92._28_4_;
  auVar82._4_4_ = auVar85._4_4_ * fVar209;
  auVar82._0_4_ = auVar85._0_4_ * fVar137;
  auVar82._8_4_ = auVar85._8_4_ * fVar221;
  auVar82._12_4_ = auVar85._12_4_ * fVar222;
  auVar82._16_4_ = auVar85._16_4_ * fVar115;
  auVar82._20_4_ = auVar85._20_4_ * fVar116;
  auVar82._24_4_ = auVar85._24_4_ * fVar223;
  auVar82._28_4_ = auVar79._28_4_;
  auVar65 = vfmadd231ps_fma(auVar87,auVar86,auVar80);
  auVar68 = vfmadd231ps_fma(auVar77,auVar86,auVar94);
  auVar70 = vfmadd231ps_fma(auVar82,auVar86,auVar84);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar258,auVar81);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar258,auVar93);
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar258,auVar83);
  auVar81 = vandps_avx(ZEXT1632(auVar53),auVar97);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar199._16_4_ = 0x219392ef;
  auVar199._20_4_ = 0x219392ef;
  auVar199._24_4_ = 0x219392ef;
  auVar199._28_4_ = 0x219392ef;
  uVar52 = vcmpps_avx512vl(auVar81,auVar199,1);
  bVar14 = (bool)((byte)uVar52 & 1);
  auVar78._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar53._0_4_;
  bVar14 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar53._4_4_;
  bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar53._8_4_;
  bVar14 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar53._12_4_;
  auVar78._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * 0x219392ef;
  auVar78._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * 0x219392ef;
  auVar78._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * 0x219392ef;
  auVar78._28_4_ = (uint)(byte)(uVar52 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar54),auVar97);
  uVar52 = vcmpps_avx512vl(auVar81,auVar199,1);
  bVar14 = (bool)((byte)uVar52 & 1);
  auVar89._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar54._0_4_;
  bVar14 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar54._4_4_;
  bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar54._8_4_;
  bVar14 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar54._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar52 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar69),auVar97);
  uVar52 = vcmpps_avx512vl(auVar81,auVar199,1);
  bVar14 = (bool)((byte)uVar52 & 1);
  auVar81._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar69._0_4_;
  bVar14 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar69._4_4_;
  bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar69._8_4_;
  bVar14 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar69._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar52 >> 7) * 0x219392ef;
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar152._8_4_ = 0x3f800000;
  auVar152._0_8_ = &DAT_3f8000003f800000;
  auVar152._12_4_ = 0x3f800000;
  auVar152._16_4_ = 0x3f800000;
  auVar152._20_4_ = 0x3f800000;
  auVar152._24_4_ = 0x3f800000;
  auVar152._28_4_ = 0x3f800000;
  auVar53 = vfnmadd213ps_fma(auVar78,auVar80,auVar152);
  auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar89);
  auVar54 = vfnmadd213ps_fma(auVar89,auVar80,auVar152);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar81);
  auVar69 = vfnmadd213ps_fma(auVar81,auVar80,auVar152);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar80,auVar80);
  fVar137 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar48 + 0x16)) *
            *(float *)(prim + lVar48 + 0x1a);
  auVar145._4_4_ = fVar137;
  auVar145._0_4_ = fVar137;
  auVar145._8_4_ = fVar137;
  auVar145._12_4_ = fVar137;
  auVar145._16_4_ = fVar137;
  auVar145._20_4_ = fVar137;
  auVar145._24_4_ = fVar137;
  auVar145._28_4_ = fVar137;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 7 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 0xb + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 9 + 6));
  auVar65 = vfmadd213ps_fma(auVar80,auVar145,auVar81);
  auVar81 = vcvtdq2ps_avx(auVar92);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 0xd + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar68 = vfmadd213ps_fma(auVar80,auVar145,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 0x12 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar52 = (ulong)(uint)((int)(uVar44 * 5) << 2);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 2 + uVar52 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar70 = vfmadd213ps_fma(auVar80,auVar145,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 0x18 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar66 = vfmadd213ps_fma(auVar80,auVar145,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 0x1d + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 + (ulong)(byte)PVar5 * 0x20 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar67 = vfmadd213ps_fma(auVar80,auVar145,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar5 * 0x20 - uVar44) + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 * 0x23 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar72 = vfmadd213ps_fma(auVar80,auVar145,auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar73));
  auVar83._4_4_ = auVar53._4_4_ * auVar81._4_4_;
  auVar83._0_4_ = auVar53._0_4_ * auVar81._0_4_;
  auVar83._8_4_ = auVar53._8_4_ * auVar81._8_4_;
  auVar83._12_4_ = auVar53._12_4_ * auVar81._12_4_;
  auVar83._16_4_ = auVar81._16_4_ * 0.0;
  auVar83._20_4_ = auVar81._20_4_ * 0.0;
  auVar83._24_4_ = auVar81._24_4_ * 0.0;
  auVar83._28_4_ = auVar81._28_4_;
  auVar81 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar73));
  auVar95._0_4_ = auVar53._0_4_ * auVar81._0_4_;
  auVar95._4_4_ = auVar53._4_4_ * auVar81._4_4_;
  auVar95._8_4_ = auVar53._8_4_ * auVar81._8_4_;
  auVar95._12_4_ = auVar53._12_4_ * auVar81._12_4_;
  auVar95._16_4_ = auVar81._16_4_ * 0.0;
  auVar95._20_4_ = auVar81._20_4_ * 0.0;
  auVar95._24_4_ = auVar81._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar81 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar74));
  auVar84._4_4_ = auVar54._4_4_ * auVar81._4_4_;
  auVar84._0_4_ = auVar54._0_4_ * auVar81._0_4_;
  auVar84._8_4_ = auVar54._8_4_ * auVar81._8_4_;
  auVar84._12_4_ = auVar54._12_4_ * auVar81._12_4_;
  auVar84._16_4_ = auVar81._16_4_ * 0.0;
  auVar84._20_4_ = auVar81._20_4_ * 0.0;
  auVar84._24_4_ = auVar81._24_4_ * 0.0;
  auVar84._28_4_ = auVar81._28_4_;
  auVar81 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar74));
  auVar91._0_4_ = auVar54._0_4_ * auVar81._0_4_;
  auVar91._4_4_ = auVar54._4_4_ * auVar81._4_4_;
  auVar91._8_4_ = auVar54._8_4_ * auVar81._8_4_;
  auVar91._12_4_ = auVar54._12_4_ * auVar81._12_4_;
  auVar91._16_4_ = auVar81._16_4_ * 0.0;
  auVar91._20_4_ = auVar81._20_4_ * 0.0;
  auVar91._24_4_ = auVar81._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar81 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar117));
  auVar85._4_4_ = auVar69._4_4_ * auVar81._4_4_;
  auVar85._0_4_ = auVar69._0_4_ * auVar81._0_4_;
  auVar85._8_4_ = auVar69._8_4_ * auVar81._8_4_;
  auVar85._12_4_ = auVar69._12_4_ * auVar81._12_4_;
  auVar85._16_4_ = auVar81._16_4_ * 0.0;
  auVar85._20_4_ = auVar81._20_4_ * 0.0;
  auVar85._24_4_ = auVar81._24_4_ * 0.0;
  auVar85._28_4_ = auVar81._28_4_;
  auVar81 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar117));
  auVar90._0_4_ = auVar69._0_4_ * auVar81._0_4_;
  auVar90._4_4_ = auVar69._4_4_ * auVar81._4_4_;
  auVar90._8_4_ = auVar69._8_4_ * auVar81._8_4_;
  auVar90._12_4_ = auVar69._12_4_ * auVar81._12_4_;
  auVar90._16_4_ = auVar81._16_4_ * 0.0;
  auVar90._20_4_ = auVar81._20_4_ * 0.0;
  auVar90._24_4_ = auVar81._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar83,auVar95);
  auVar80 = vpminsd_avx2(auVar84,auVar91);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80 = vpminsd_avx2(auVar85,auVar90);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar92._4_4_ = uVar112;
  auVar92._0_4_ = uVar112;
  auVar92._8_4_ = uVar112;
  auVar92._12_4_ = uVar112;
  auVar92._16_4_ = uVar112;
  auVar92._20_4_ = uVar112;
  auVar92._24_4_ = uVar112;
  auVar92._28_4_ = uVar112;
  auVar80 = vmaxps_avx512vl(auVar80,auVar92);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar81,auVar80);
  auVar81 = vpmaxsd_avx2(auVar83,auVar95);
  auVar80 = vpmaxsd_avx2(auVar84,auVar91);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar80 = vpmaxsd_avx2(auVar85,auVar90);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar93._4_4_ = uVar112;
  auVar93._0_4_ = uVar112;
  auVar93._8_4_ = uVar112;
  auVar93._12_4_ = uVar112;
  auVar93._16_4_ = uVar112;
  auVar93._20_4_ = uVar112;
  auVar93._24_4_ = uVar112;
  auVar93._28_4_ = uVar112;
  auVar80 = vminps_avx512vl(auVar80,auVar93);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar94);
  auVar80 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar80,_DAT_0205a920);
  uVar22 = vcmpps_avx512vl(local_200,auVar81,2);
  if ((byte)((byte)uVar22 & (byte)uVar23) == 0) {
    return;
  }
  uVar52 = (ulong)(byte)((byte)uVar22 & (byte)uVar23);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar266 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar271 = ZEXT1664(auVar53);
LAB_01ec11e2:
  lVar48 = 0;
  for (uVar44 = uVar52; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
    lVar48 = lVar48 + 1;
  }
  uVar51 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar51].ptr;
  fVar137 = (pGVar8->time_range).lower;
  fVar137 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar137) / ((pGVar8->time_range).upper - fVar137));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
  uVar6 = *(uint *)(prim + lVar48 * 4 + 6);
  auVar54 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar53 = vminss_avx(auVar53,auVar54);
  auVar55 = vmaxss_avx512f(auVar266._0_16_,auVar53);
  uVar44 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar6 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar46 = (long)(int)auVar55._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar46);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar46);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar44);
  lVar48 = uVar44 + 1;
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar48);
  lVar1 = uVar44 + 2;
  auVar69 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar44 + 3;
  auVar65 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar46);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar46);
  auVar68 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar44);
  auVar70 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar48);
  auVar66 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar67 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar46);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar46);
  auVar72 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar44);
  auVar73 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar48);
  auVar74 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar117 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar46);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar46);
  auVar118 = *(undefined1 (*) [16])(lVar11 + uVar44 * lVar10);
  auVar127 = *(undefined1 (*) [16])(lVar11 + lVar48 * lVar10);
  auVar75 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar56 = vsubss_avx512f(ZEXT416((uint)fVar137),auVar55);
  auVar113._0_12_ = ZEXT812(0);
  auVar113._12_4_ = 0;
  auVar55 = vmulps_avx512vl(auVar65,auVar113);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar58 = vfmadd213ps_avx512vl(auVar57,auVar69,auVar55);
  auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar54,auVar59);
  auVar60 = vfmadd231ps_avx512vl(auVar58,auVar53,auVar57);
  auVar163 = auVar271._0_16_;
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar69,auVar163);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar54,auVar113);
  auVar61 = vfnmadd231ps_avx512vl(auVar55,auVar53,auVar163);
  auVar58._0_4_ = auVar67._0_4_ * 0.0;
  auVar58._4_4_ = auVar67._4_4_ * 0.0;
  auVar58._8_4_ = auVar67._8_4_ * 0.0;
  auVar58._12_4_ = auVar67._12_4_ * 0.0;
  auVar55 = vfmadd213ps_avx512vl(auVar57,auVar66,auVar58);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar70,auVar59);
  auVar62 = vfmadd231ps_avx512vl(auVar55,auVar68,auVar57);
  auVar55 = vfmadd231ps_avx512vl(auVar58,auVar66,auVar163);
  auVar55 = vfnmadd231ps_fma(auVar55,auVar70,auVar113);
  auVar63 = vfnmadd231ps_avx512vl(auVar55,auVar68,auVar163);
  auVar55 = vmulps_avx512vl(auVar65,auVar57);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar69,auVar59);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar57);
  auVar64 = vfmadd231ps_avx512vl(auVar55,auVar53,auVar113);
  auVar65 = vmulps_avx512vl(auVar65,auVar163);
  auVar69 = vfmadd231ps_fma(auVar65,auVar113,auVar69);
  auVar54 = vfnmadd231ps_avx512vl(auVar69,auVar163,auVar54);
  auVar58 = vfnmadd231ps_fma(auVar54,auVar113,auVar53);
  auVar53 = vmulps_avx512vl(auVar67,auVar57);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar59);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar70,auVar57);
  auVar55 = vfmadd231ps_fma(auVar53,auVar68,auVar113);
  auVar53 = vmulps_avx512vl(auVar67,auVar163);
  auVar53 = vfmadd231ps_fma(auVar53,auVar113,auVar66);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar163,auVar70);
  auVar70 = vfnmadd231ps_fma(auVar53,auVar113,auVar68);
  auVar54 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  auVar53 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar53 = vmulps_avx512vl(auVar61,auVar53);
  auVar53 = vfmsub231ps_avx512vl(auVar53,auVar54,auVar62);
  auVar69 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar53 = vmulps_avx512vl(auVar61,auVar53);
  auVar53 = vfmsub231ps_fma(auVar53,auVar54,auVar63);
  auVar65 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar54 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar162._0_4_ = auVar58._0_4_ * auVar54._0_4_;
  auVar162._4_4_ = auVar58._4_4_ * auVar54._4_4_;
  auVar162._8_4_ = auVar58._8_4_ * auVar54._8_4_;
  auVar162._12_4_ = auVar58._12_4_ * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar162,auVar53,auVar55);
  auVar68 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar76._0_4_ = auVar58._0_4_ * auVar54._0_4_;
  auVar76._4_4_ = auVar58._4_4_ * auVar54._4_4_;
  auVar76._8_4_ = auVar58._8_4_ * auVar54._8_4_;
  auVar76._12_4_ = auVar58._12_4_ * auVar54._12_4_;
  auVar53 = vfmsub231ps_fma(auVar76,auVar53,auVar70);
  auVar70 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar69,auVar69,0x7f);
  auVar54 = vrsqrt14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar66 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar67 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar67 = vmulss_avx512f(auVar67,auVar54);
  auVar54 = vmulss_avx512f(auVar67,ZEXT416((uint)(auVar54._0_4_ * auVar54._0_4_)));
  fVar137 = auVar66._0_4_ + auVar54._0_4_;
  auVar182._4_4_ = fVar137;
  auVar182._0_4_ = fVar137;
  auVar182._8_4_ = fVar137;
  auVar182._12_4_ = fVar137;
  auVar54 = vdpps_avx(auVar69,auVar65,0x7f);
  auVar66 = vmulps_avx512vl(auVar69,auVar182);
  auVar67 = vbroadcastss_avx512vl(auVar53);
  auVar65 = vmulps_avx512vl(auVar67,auVar65);
  fVar111 = auVar54._0_4_;
  auVar63._0_4_ = fVar111 * auVar69._0_4_;
  auVar63._4_4_ = fVar111 * auVar69._4_4_;
  auVar63._8_4_ = fVar111 * auVar69._8_4_;
  auVar63._12_4_ = fVar111 * auVar69._12_4_;
  auVar69 = vsubps_avx(auVar65,auVar63);
  auVar54 = vrcp14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  fVar209 = auVar54._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar54 = vrsqrt14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar65 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar67 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  fVar111 = auVar54._0_4_;
  fVar111 = auVar65._0_4_ + auVar67._0_4_ * fVar111 * fVar111 * fVar111;
  auVar183._0_4_ = auVar68._0_4_ * fVar111;
  auVar183._4_4_ = auVar68._4_4_ * fVar111;
  auVar183._8_4_ = auVar68._8_4_ * fVar111;
  auVar183._12_4_ = auVar68._12_4_ * fVar111;
  auVar54 = vdpps_avx(auVar68,auVar70,0x7f);
  auVar65 = vbroadcastss_avx512vl(auVar53);
  auVar65 = vmulps_avx512vl(auVar65,auVar70);
  fVar221 = auVar54._0_4_;
  auVar55._0_4_ = fVar221 * auVar68._0_4_;
  auVar55._4_4_ = fVar221 * auVar68._4_4_;
  auVar55._8_4_ = fVar221 * auVar68._8_4_;
  auVar55._12_4_ = fVar221 * auVar68._12_4_;
  auVar54 = vsubps_avx(auVar65,auVar55);
  auVar65 = vrcp14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar65,ZEXT416(0x40000000));
  fVar221 = auVar65._0_4_ * auVar53._0_4_;
  auVar53 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar65 = vmulps_avx512vl(auVar53,auVar66);
  auVar67 = vsubps_avx512vl(auVar60,auVar65);
  auVar68 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar68 = vmulps_avx512vl(auVar68,auVar66);
  auVar62._0_4_ = auVar68._0_4_ + auVar53._0_4_ * fVar137 * fVar209 * auVar69._0_4_;
  auVar62._4_4_ = auVar68._4_4_ + auVar53._4_4_ * fVar137 * fVar209 * auVar69._4_4_;
  auVar62._8_4_ = auVar68._8_4_ + auVar53._8_4_ * fVar137 * fVar209 * auVar69._8_4_;
  auVar62._12_4_ = auVar68._12_4_ + auVar53._12_4_ * fVar137 * fVar209 * auVar69._12_4_;
  auVar69 = vsubps_avx512vl(auVar61,auVar62);
  auVar55 = vaddps_avx512vl(auVar60,auVar65);
  auVar65 = vaddps_avx512vl(auVar61,auVar62);
  auVar53 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar68 = vmulps_avx512vl(auVar53,auVar183);
  auVar60 = vsubps_avx512vl(auVar64,auVar68);
  auVar70 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar70 = vmulps_avx512vl(auVar70,auVar183);
  auVar184._0_4_ = auVar70._0_4_ + auVar53._0_4_ * fVar111 * auVar54._0_4_ * fVar221;
  auVar184._4_4_ = auVar70._4_4_ + auVar53._4_4_ * fVar111 * auVar54._4_4_ * fVar221;
  auVar184._8_4_ = auVar70._8_4_ + auVar53._8_4_ * fVar111 * auVar54._8_4_ * fVar221;
  auVar184._12_4_ = auVar70._12_4_ + auVar53._12_4_ * fVar111 * auVar54._12_4_ * fVar221;
  auVar53 = vsubps_avx(auVar58,auVar184);
  auVar61 = vaddps_avx512vl(auVar64,auVar68);
  auVar54 = vaddps_avx512vl(auVar58,auVar184);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar69 = vmulps_avx512vl(auVar69,auVar58);
  auVar170._0_4_ = auVar67._0_4_ + auVar69._0_4_;
  auVar170._4_4_ = auVar67._4_4_ + auVar69._4_4_;
  auVar170._8_4_ = auVar67._8_4_ + auVar69._8_4_;
  auVar170._12_4_ = auVar67._12_4_ + auVar69._12_4_;
  auVar53 = vmulps_avx512vl(auVar53,auVar58);
  auVar66 = vsubps_avx(auVar60,auVar53);
  auVar53 = vmulps_avx512vl(auVar65,auVar58);
  local_570._4_4_ = auVar55._4_4_ + auVar53._4_4_;
  local_570._0_4_ = auVar55._0_4_ + auVar53._0_4_;
  fStack_568 = auVar55._8_4_ + auVar53._8_4_;
  fStack_564 = auVar55._12_4_ + auVar53._12_4_;
  auVar53 = vmulps_avx512vl(auVar54,auVar58);
  auVar62 = vsubps_avx512vl(auVar61,auVar53);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar54 = vmulps_avx512vl(auVar117,auVar113);
  auVar69 = vfmadd213ps_avx512vl(auVar57,auVar74,auVar54);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar59);
  auVar63 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar57);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar74,auVar163);
  auVar54 = vfnmadd231ps_fma(auVar54,auVar73,auVar113);
  auVar64 = vfnmadd231ps_avx512vl(auVar54,auVar72,auVar163);
  auVar54 = vmulps_avx512vl(auVar53,auVar113);
  auVar69 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar54);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar127,auVar59);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar118,auVar57);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar75,auVar163);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar127,auVar113);
  auVar65 = vfnmadd231ps_avx512vl(auVar54,auVar118,auVar163);
  auVar54 = vmulps_avx512vl(auVar117,auVar57);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar74,auVar59);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar73,auVar57);
  auVar71 = vfmadd231ps_avx512vl(auVar54,auVar72,auVar113);
  auVar54 = vmulps_avx512vl(auVar117,auVar163);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar113,auVar74);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar163,auVar73);
  auVar72 = vfnmadd231ps_avx512vl(auVar54,auVar113,auVar72);
  auVar54 = vmulps_avx512vl(auVar53,auVar57);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar75,auVar59);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar127,auVar57);
  auVar54 = vfmadd231ps_fma(auVar54,auVar118,auVar113);
  auVar53 = vmulps_avx512vl(auVar53,auVar163);
  auVar53 = vfmadd231ps_fma(auVar53,auVar113,auVar75);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar163,auVar127);
  auVar70 = vfnmadd231ps_fma(auVar53,auVar113,auVar118);
  auVar53 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar68 = vshufps_avx512vl(auVar69,auVar69,0xc9);
  fVar221 = auVar64._0_4_;
  auVar234._0_4_ = fVar221 * auVar68._0_4_;
  fVar222 = auVar64._4_4_;
  auVar234._4_4_ = fVar222 * auVar68._4_4_;
  fVar115 = auVar64._8_4_;
  auVar234._8_4_ = fVar115 * auVar68._8_4_;
  fVar116 = auVar64._12_4_;
  auVar234._12_4_ = fVar116 * auVar68._12_4_;
  auVar69 = vfmsub231ps_avx512vl(auVar234,auVar53,auVar69);
  auVar69 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar68 = vshufps_avx512vl(auVar65,auVar65,0xc9);
  auVar244._0_4_ = fVar221 * auVar68._0_4_;
  auVar244._4_4_ = fVar222 * auVar68._4_4_;
  auVar244._8_4_ = fVar115 * auVar68._8_4_;
  auVar244._12_4_ = fVar116 * auVar68._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar244,auVar53,auVar65);
  auVar65 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar73 = vshufps_avx512vl(auVar72,auVar72,0xc9);
  auVar53 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar53 = vmulps_avx512vl(auVar72,auVar53);
  auVar53 = vfmsub231ps_fma(auVar53,auVar73,auVar54);
  auVar68 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar54 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar53 = vdpps_avx(auVar69,auVar69,0x7f);
  auVar54 = vmulps_avx512vl(auVar72,auVar54);
  auVar54 = vfmsub231ps_fma(auVar54,auVar73,auVar70);
  auVar70 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vrsqrt14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar73 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar74 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar74 = vmulss_avx512f(auVar74,auVar54);
  auVar54 = vmulss_avx512f(auVar74,ZEXT416((uint)(auVar54._0_4_ * auVar54._0_4_)));
  auVar54 = vaddss_avx512f(auVar73,auVar54);
  auVar260._0_4_ = auVar54._0_4_;
  auVar260._4_4_ = auVar260._0_4_;
  auVar260._8_4_ = auVar260._0_4_;
  auVar260._12_4_ = auVar260._0_4_;
  auVar73 = vmulps_avx512vl(auVar69,auVar260);
  auVar54 = vdpps_avx(auVar69,auVar65,0x7f);
  auVar74 = vbroadcastss_avx512vl(auVar53);
  auVar65 = vmulps_avx512vl(auVar74,auVar65);
  fVar137 = auVar54._0_4_;
  auVar75._0_4_ = auVar69._0_4_ * fVar137;
  auVar75._4_4_ = auVar69._4_4_ * fVar137;
  auVar75._8_4_ = auVar69._8_4_ * fVar137;
  auVar75._12_4_ = auVar69._12_4_ * fVar137;
  auVar69 = vsubps_avx(auVar65,auVar75);
  auVar54 = vrcp14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  fVar111 = auVar54._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar54 = vrsqrt14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar65 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar74 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar137 = auVar54._0_4_;
  fVar137 = auVar65._0_4_ + auVar74._0_4_ * fVar137 * fVar137 * fVar137;
  auVar252._0_4_ = auVar68._0_4_ * fVar137;
  auVar252._4_4_ = auVar68._4_4_ * fVar137;
  auVar252._8_4_ = auVar68._8_4_ * fVar137;
  auVar252._12_4_ = auVar68._12_4_ * fVar137;
  auVar54 = vdpps_avx(auVar68,auVar70,0x7f);
  auVar65 = vbroadcastss_avx512vl(auVar53);
  auVar65 = vmulps_avx512vl(auVar65,auVar70);
  fVar209 = auVar54._0_4_;
  auVar210._0_4_ = fVar209 * auVar68._0_4_;
  auVar210._4_4_ = fVar209 * auVar68._4_4_;
  auVar210._8_4_ = fVar209 * auVar68._8_4_;
  auVar210._12_4_ = fVar209 * auVar68._12_4_;
  auVar54 = vsubps_avx(auVar65,auVar210);
  auVar65 = vrcp14ss_avx512f(auVar113,ZEXT416(auVar53._0_4_));
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar65,ZEXT416(0x40000000));
  auVar269 = ZEXT464(0x3f800000);
  fVar209 = auVar53._0_4_ * auVar65._0_4_;
  auVar65 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar68 = vmulps_avx512vl(auVar65,auVar73);
  auVar70 = vsubps_avx512vl(auVar63,auVar68);
  auVar53 = vshufps_avx(auVar64,auVar64,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar73);
  auVar59._0_4_ = auVar53._0_4_ + auVar65._0_4_ * auVar260._0_4_ * fVar111 * auVar69._0_4_;
  auVar59._4_4_ = auVar53._4_4_ + auVar65._4_4_ * auVar260._0_4_ * fVar111 * auVar69._4_4_;
  auVar59._8_4_ = auVar53._8_4_ + auVar65._8_4_ * auVar260._0_4_ * fVar111 * auVar69._8_4_;
  auVar59._12_4_ = auVar53._12_4_ + auVar65._12_4_ * auVar260._0_4_ * fVar111 * auVar69._12_4_;
  auVar53 = vsubps_avx(auVar64,auVar59);
  auVar69 = vaddps_avx512vl(auVar63,auVar68);
  auVar64._0_4_ = fVar221 + auVar59._0_4_;
  auVar64._4_4_ = fVar222 + auVar59._4_4_;
  auVar64._8_4_ = fVar115 + auVar59._8_4_;
  auVar64._12_4_ = fVar116 + auVar59._12_4_;
  auVar65 = vshufps_avx512vl(auVar71,auVar71,0xff);
  auVar245._0_4_ = auVar65._0_4_ * auVar252._0_4_;
  auVar245._4_4_ = auVar65._4_4_ * auVar252._4_4_;
  auVar245._8_4_ = auVar65._8_4_ * auVar252._8_4_;
  auVar245._12_4_ = auVar65._12_4_ * auVar252._12_4_;
  auVar68 = vsubps_avx512vl(auVar71,auVar245);
  auVar73 = vshufps_avx512vl(auVar72,auVar72,0xff);
  auVar73 = vmulps_avx512vl(auVar73,auVar252);
  auVar163._0_4_ = auVar73._0_4_ + auVar65._0_4_ * fVar137 * auVar54._0_4_ * fVar209;
  auVar163._4_4_ = auVar73._4_4_ + auVar65._4_4_ * fVar137 * auVar54._4_4_ * fVar209;
  auVar163._8_4_ = auVar73._8_4_ + auVar65._8_4_ * fVar137 * auVar54._8_4_ * fVar209;
  auVar163._12_4_ = auVar73._12_4_ + auVar65._12_4_ * fVar137 * auVar54._12_4_ * fVar209;
  auVar54 = vsubps_avx512vl(auVar72,auVar163);
  auVar65 = vaddps_avx512vl(auVar71,auVar245);
  auVar72 = vaddps_avx512vl(auVar72,auVar163);
  auVar53 = vmulps_avx512vl(auVar53,auVar58);
  auVar211._0_4_ = auVar70._0_4_ + auVar53._0_4_;
  auVar211._4_4_ = auVar70._4_4_ + auVar53._4_4_;
  auVar211._8_4_ = auVar70._8_4_ + auVar53._8_4_;
  auVar211._12_4_ = auVar70._12_4_ + auVar53._12_4_;
  auVar53 = vmulps_avx512vl(auVar54,auVar58);
  auVar53 = vsubps_avx(auVar68,auVar53);
  auVar54 = vmulps_avx512vl(auVar64,auVar58);
  auVar71._0_4_ = auVar69._0_4_ + auVar54._0_4_;
  auVar71._4_4_ = auVar69._4_4_ + auVar54._4_4_;
  auVar71._8_4_ = auVar69._8_4_ + auVar54._8_4_;
  auVar71._12_4_ = auVar69._12_4_ + auVar54._12_4_;
  auVar54 = vmulps_avx512vl(auVar72,auVar58);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar270 = ZEXT1664(auVar58);
  auVar54 = vsubps_avx(auVar65,auVar54);
  auVar72 = vbroadcastss_avx512vl(auVar56);
  auVar73 = vsubss_avx512f(ZEXT416(0x3f800000),auVar56);
  auVar74._0_4_ = auVar73._0_4_;
  auVar74._4_4_ = auVar74._0_4_;
  auVar74._8_4_ = auVar74._0_4_;
  auVar74._12_4_ = auVar74._0_4_;
  auVar70 = vmulps_avx512vl(auVar72,auVar70);
  auVar73 = vmulps_avx512vl(auVar72,auVar211);
  auVar53 = vmulps_avx512vl(auVar72,auVar53);
  auVar261._0_4_ = auVar72._0_4_ * auVar68._0_4_;
  auVar261._4_4_ = auVar72._4_4_ * auVar68._4_4_;
  auVar261._8_4_ = auVar72._8_4_ * auVar68._8_4_;
  auVar261._12_4_ = auVar72._12_4_ * auVar68._12_4_;
  local_330 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar67);
  local_340 = vfmadd231ps_avx512vl(auVar73,auVar74,auVar170);
  local_350 = vfmadd231ps_avx512vl(auVar53,auVar74,auVar66);
  local_360 = vfmadd231ps_fma(auVar261,auVar74,auVar60);
  auVar53 = vmulps_avx512vl(auVar72,auVar69);
  auVar69 = vmulps_avx512vl(auVar72,auVar71);
  auVar54 = vmulps_avx512vl(auVar72,auVar54);
  auVar246._0_4_ = auVar72._0_4_ * auVar65._0_4_;
  auVar246._4_4_ = auVar72._4_4_ * auVar65._4_4_;
  auVar246._8_4_ = auVar72._8_4_ * auVar65._8_4_;
  auVar246._12_4_ = auVar72._12_4_ * auVar65._12_4_;
  _local_370 = vfmadd231ps_avx512vl(auVar53,auVar74,auVar55);
  _local_380 = vfmadd231ps_avx512vl(auVar69,auVar74,_local_570);
  _local_390 = vfmadd231ps_avx512vl(auVar54,auVar74,auVar62);
  _local_3a0 = vfmadd231ps_fma(auVar246,auVar74,auVar61);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar137 = *(float *)(ray + k * 4 + 0x60);
  local_2b0 = vsubps_avx512vl(local_330,auVar53);
  uVar112 = local_2b0._0_4_;
  auVar117._4_4_ = uVar112;
  auVar117._0_4_ = uVar112;
  auVar117._8_4_ = uVar112;
  auVar117._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar69 = vshufps_avx(local_2b0,local_2b0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar111 = pre->ray_space[k].vz.field_0.m128[0];
  fVar209 = pre->ray_space[k].vz.field_0.m128[1];
  fVar221 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  auVar73._0_4_ = fVar111 * auVar69._0_4_;
  auVar73._4_4_ = fVar209 * auVar69._4_4_;
  auVar73._8_4_ = fVar221 * auVar69._8_4_;
  auVar73._12_4_ = fVar222 * auVar69._12_4_;
  auVar54 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar54);
  auVar66 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar117);
  local_2c0 = vsubps_avx512vl(local_340,auVar53);
  uVar112 = local_2c0._0_4_;
  auVar127._4_4_ = uVar112;
  auVar127._0_4_ = uVar112;
  auVar127._8_4_ = uVar112;
  auVar127._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar69 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar118._0_4_ = fVar111 * auVar69._0_4_;
  auVar118._4_4_ = fVar209 * auVar69._4_4_;
  auVar118._8_4_ = fVar221 * auVar69._8_4_;
  auVar118._12_4_ = fVar222 * auVar69._12_4_;
  auVar54 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar4,auVar54);
  auVar67 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar127);
  local_2d0 = vsubps_avx512vl(local_350,auVar53);
  uVar112 = local_2d0._0_4_;
  auVar60._4_4_ = uVar112;
  auVar60._0_4_ = uVar112;
  auVar60._8_4_ = uVar112;
  auVar60._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar69 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar56._0_4_ = fVar111 * auVar69._0_4_;
  auVar56._4_4_ = fVar209 * auVar69._4_4_;
  auVar56._8_4_ = fVar221 * auVar69._8_4_;
  auVar56._12_4_ = fVar222 * auVar69._12_4_;
  auVar54 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar54);
  auVar72 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar60);
  local_2e0 = vsubps_avx(local_360,auVar53);
  uVar112 = local_2e0._0_4_;
  auVar185._4_4_ = uVar112;
  auVar185._0_4_ = uVar112;
  auVar185._8_4_ = uVar112;
  auVar185._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar69 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar61._0_4_ = fVar111 * auVar69._0_4_;
  auVar61._4_4_ = fVar209 * auVar69._4_4_;
  auVar61._8_4_ = fVar221 * auVar69._8_4_;
  auVar61._12_4_ = fVar222 * auVar69._12_4_;
  auVar54 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar54);
  auVar73 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar185);
  local_2f0 = vsubps_avx512vl(_local_370,auVar53);
  uVar112 = local_2f0._0_4_;
  auVar186._4_4_ = uVar112;
  auVar186._0_4_ = uVar112;
  auVar186._8_4_ = uVar112;
  auVar186._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar69 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar212._0_4_ = auVar69._0_4_ * fVar111;
  auVar212._4_4_ = auVar69._4_4_ * fVar209;
  auVar212._8_4_ = auVar69._8_4_ * fVar221;
  auVar212._12_4_ = auVar69._12_4_ * fVar222;
  auVar54 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar4,auVar54);
  auVar74 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar186);
  local_300 = vsubps_avx512vl(_local_380,auVar53);
  uVar112 = local_300._0_4_;
  auVar187._4_4_ = uVar112;
  auVar187._0_4_ = uVar112;
  auVar187._8_4_ = uVar112;
  auVar187._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_300,local_300,0x55);
  auVar69 = vshufps_avx(local_300,local_300,0xaa);
  auVar226._0_4_ = auVar69._0_4_ * fVar111;
  auVar226._4_4_ = auVar69._4_4_ * fVar209;
  auVar226._8_4_ = auVar69._8_4_ * fVar221;
  auVar226._12_4_ = auVar69._12_4_ * fVar222;
  auVar54 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar4,auVar54);
  auVar117 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar187);
  local_310 = vsubps_avx512vl(_local_390,auVar53);
  uVar112 = local_310._0_4_;
  auVar188._4_4_ = uVar112;
  auVar188._0_4_ = uVar112;
  auVar188._8_4_ = uVar112;
  auVar188._12_4_ = uVar112;
  auVar54 = vshufps_avx(local_310,local_310,0x55);
  auVar69 = vshufps_avx(local_310,local_310,0xaa);
  auVar235._0_4_ = auVar69._0_4_ * fVar111;
  auVar235._4_4_ = auVar69._4_4_ * fVar209;
  auVar235._8_4_ = auVar69._8_4_ * fVar221;
  auVar235._12_4_ = auVar69._12_4_ * fVar222;
  auVar54 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar4,auVar54);
  auVar118 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar188);
  local_320 = vsubps_avx(_local_3a0,auVar53);
  uVar112 = local_320._0_4_;
  auVar57._4_4_ = uVar112;
  auVar57._0_4_ = uVar112;
  auVar57._8_4_ = uVar112;
  auVar57._12_4_ = uVar112;
  auVar53 = vshufps_avx(local_320,local_320,0x55);
  auVar54 = vshufps_avx(local_320,local_320,0xaa);
  auVar171._0_4_ = auVar54._0_4_ * fVar111;
  auVar171._4_4_ = auVar54._4_4_ * fVar209;
  auVar171._8_4_ = auVar54._8_4_ * fVar221;
  auVar171._12_4_ = auVar54._12_4_ * fVar222;
  auVar53 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar4,auVar53);
  auVar127 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar3,auVar57);
  auVar69 = vmovlhps_avx(auVar66,auVar74);
  auVar65 = vmovlhps_avx(auVar67,auVar117);
  auVar68 = vmovlhps_avx(auVar72,auVar118);
  _local_450 = vmovlhps_avx512f(auVar73,auVar127);
  auVar54 = vminps_avx(auVar69,auVar65);
  auVar53 = vmaxps_avx(auVar69,auVar65);
  auVar70 = vminps_avx512vl(auVar68,_local_450);
  auVar54 = vminps_avx(auVar54,auVar70);
  auVar70 = vmaxps_avx512vl(auVar68,_local_450);
  auVar53 = vmaxps_avx(auVar53,auVar70);
  auVar70 = vshufpd_avx(auVar54,auVar54,3);
  auVar54 = vminps_avx(auVar54,auVar70);
  auVar70 = vshufpd_avx(auVar53,auVar53,3);
  auVar53 = vmaxps_avx(auVar53,auVar70);
  auVar54 = vandps_avx512vl(auVar54,auVar58);
  auVar53 = vandps_avx512vl(auVar53,auVar58);
  auVar53 = vmaxps_avx(auVar54,auVar53);
  auVar54 = vmovshdup_avx(auVar53);
  auVar53 = vmaxss_avx(auVar54,auVar53);
  local_420 = vmovddup_avx512vl(auVar66);
  local_430 = vmovddup_avx512vl(auVar67);
  local_440 = vmovddup_avx512vl(auVar72);
  auVar164._0_8_ = auVar73._0_8_;
  auVar164._8_8_ = auVar164._0_8_;
  local_460 = ZEXT416((uint)(auVar53._0_4_ * 9.536743e-07));
  local_1c0 = vbroadcastss_avx512vl(local_460);
  auVar53 = vxorps_avx512vl(local_1c0._0_16_,auVar75);
  local_1e0 = vbroadcastss_avx512vl(auVar53);
  uVar44 = 0;
  auVar54 = vsubps_avx(auVar65,auVar69);
  local_290 = vsubps_avx(auVar68,auVar65);
  local_2a0 = vsubps_avx512vl(_local_450,auVar68);
  local_3b0 = vsubps_avx512vl(_local_370,local_330);
  local_3c0 = vsubps_avx512vl(_local_380,local_340);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(3));
  local_3d0 = vsubps_avx512vl(_local_390,local_350);
  _local_3e0 = vsubps_avx(_local_3a0,local_360);
  local_220 = vpbroadcastd_avx512vl();
  local_240 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar264 = ZEXT1664(auVar53);
  do {
    auVar58 = auVar264._0_16_;
    auVar70 = vshufps_avx(auVar58,auVar58,0x50);
    auVar247._8_4_ = 0x3f800000;
    auVar247._0_8_ = &DAT_3f8000003f800000;
    auVar247._12_4_ = 0x3f800000;
    auVar250._16_4_ = 0x3f800000;
    auVar250._0_16_ = auVar247;
    auVar250._20_4_ = 0x3f800000;
    auVar250._24_4_ = 0x3f800000;
    auVar250._28_4_ = 0x3f800000;
    auVar66 = vsubps_avx(auVar247,auVar70);
    fVar111 = auVar70._0_4_;
    fVar115 = auVar74._0_4_;
    auVar138._0_4_ = fVar115 * fVar111;
    fVar209 = auVar70._4_4_;
    fVar116 = auVar74._4_4_;
    auVar138._4_4_ = fVar116 * fVar209;
    fVar221 = auVar70._8_4_;
    auVar138._8_4_ = fVar115 * fVar221;
    fVar222 = auVar70._12_4_;
    auVar138._12_4_ = fVar116 * fVar222;
    fVar225 = auVar117._0_4_;
    auVar148._0_4_ = fVar225 * fVar111;
    fVar232 = auVar117._4_4_;
    auVar148._4_4_ = fVar232 * fVar209;
    auVar148._8_4_ = fVar225 * fVar221;
    auVar148._12_4_ = fVar232 * fVar222;
    fVar233 = auVar118._0_4_;
    auVar155._0_4_ = fVar233 * fVar111;
    fVar243 = auVar118._4_4_;
    auVar155._4_4_ = fVar243 * fVar209;
    auVar155._8_4_ = fVar233 * fVar221;
    auVar155._12_4_ = fVar243 * fVar222;
    fVar251 = auVar127._0_4_;
    auVar119._0_4_ = fVar251 * fVar111;
    fVar259 = auVar127._4_4_;
    auVar119._4_4_ = fVar259 * fVar209;
    auVar119._8_4_ = fVar251 * fVar221;
    auVar119._12_4_ = fVar259 * fVar222;
    auVar67 = vfmadd231ps_avx512vl(auVar138,auVar66,local_420);
    auVar72 = vfmadd231ps_avx512vl(auVar148,auVar66,local_430);
    auVar73 = vfmadd231ps_avx512vl(auVar155,auVar66,local_440);
    auVar66 = vfmadd231ps_fma(auVar119,auVar164,auVar66);
    auVar70 = vmovshdup_avx(auVar53);
    fVar209 = auVar53._0_4_;
    fVar111 = (auVar70._0_4_ - fVar209) * 0.04761905;
    auVar181._4_4_ = fVar209;
    auVar181._0_4_ = fVar209;
    auVar181._8_4_ = fVar209;
    auVar181._12_4_ = fVar209;
    auVar181._16_4_ = fVar209;
    auVar181._20_4_ = fVar209;
    auVar181._24_4_ = fVar209;
    auVar181._28_4_ = fVar209;
    auVar133._0_8_ = auVar70._0_8_;
    auVar133._8_8_ = auVar133._0_8_;
    auVar133._16_8_ = auVar133._0_8_;
    auVar133._24_8_ = auVar133._0_8_;
    auVar80 = vsubps_avx(auVar133,auVar181);
    uVar112 = auVar67._0_4_;
    auVar134._4_4_ = uVar112;
    auVar134._0_4_ = uVar112;
    auVar134._8_4_ = uVar112;
    auVar134._12_4_ = uVar112;
    auVar134._16_4_ = uVar112;
    auVar134._20_4_ = uVar112;
    auVar134._24_4_ = uVar112;
    auVar134._28_4_ = uVar112;
    auVar206._8_4_ = 1;
    auVar206._0_8_ = 0x100000001;
    auVar206._12_4_ = 1;
    auVar206._16_4_ = 1;
    auVar206._20_4_ = 1;
    auVar206._24_4_ = 1;
    auVar206._28_4_ = 1;
    auVar93 = ZEXT1632(auVar67);
    auVar92 = vpermps_avx2(auVar206,auVar93);
    auVar82 = vbroadcastss_avx512vl(auVar72);
    auVar94 = ZEXT1632(auVar72);
    auVar83 = vpermps_avx512vl(auVar206,auVar94);
    auVar84 = vbroadcastss_avx512vl(auVar73);
    auVar78 = ZEXT1632(auVar73);
    auVar85 = vpermps_avx512vl(auVar206,auVar78);
    auVar86 = vbroadcastss_avx512vl(auVar66);
    auVar90 = ZEXT1632(auVar66);
    auVar79 = vpermps_avx512vl(auVar206,auVar90);
    auVar207._4_4_ = fVar111;
    auVar207._0_4_ = fVar111;
    auVar207._8_4_ = fVar111;
    auVar207._12_4_ = fVar111;
    auVar207._16_4_ = fVar111;
    auVar207._20_4_ = fVar111;
    auVar207._24_4_ = fVar111;
    auVar207._28_4_ = fVar111;
    auVar168._8_4_ = 2;
    auVar168._0_8_ = 0x200000002;
    auVar168._12_4_ = 2;
    auVar168._16_4_ = 2;
    auVar168._20_4_ = 2;
    auVar168._24_4_ = 2;
    auVar168._28_4_ = 2;
    auVar87 = vpermps_avx512vl(auVar168,auVar93);
    auVar88 = vpermps_avx512vl(auVar81,auVar93);
    auVar93 = vpermps_avx2(auVar168,auVar94);
    auVar77 = vpermps_avx512vl(auVar81,auVar94);
    auVar94 = vpermps_avx2(auVar168,auVar78);
    auVar78 = vpermps_avx512vl(auVar81,auVar78);
    auVar89 = vpermps_avx512vl(auVar168,auVar90);
    auVar90 = vpermps_avx512vl(auVar81,auVar90);
    auVar70 = vfmadd132ps_fma(auVar80,auVar181,_DAT_02020f20);
    auVar81 = vsubps_avx(auVar250,ZEXT1632(auVar70));
    auVar80 = vmulps_avx512vl(auVar82,ZEXT1632(auVar70));
    auVar95 = ZEXT1632(auVar70);
    auVar91 = vmulps_avx512vl(auVar83,auVar95);
    auVar66 = vfmadd231ps_fma(auVar80,auVar81,auVar134);
    auVar67 = vfmadd231ps_fma(auVar91,auVar81,auVar92);
    auVar80 = vmulps_avx512vl(auVar84,auVar95);
    auVar91 = vmulps_avx512vl(auVar85,auVar95);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar91,auVar81,auVar83);
    auVar83 = vmulps_avx512vl(auVar86,auVar95);
    auVar91 = ZEXT1632(auVar70);
    auVar79 = vmulps_avx512vl(auVar79,auVar91);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,auVar84);
    auVar84 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar85);
    fVar221 = auVar70._0_4_;
    fVar222 = auVar70._4_4_;
    auVar28._4_4_ = fVar222 * auVar80._4_4_;
    auVar28._0_4_ = fVar221 * auVar80._0_4_;
    fVar223 = auVar70._8_4_;
    auVar28._8_4_ = fVar223 * auVar80._8_4_;
    fVar224 = auVar70._12_4_;
    auVar28._12_4_ = fVar224 * auVar80._12_4_;
    auVar28._16_4_ = auVar80._16_4_ * 0.0;
    auVar28._20_4_ = auVar80._20_4_ * 0.0;
    auVar28._24_4_ = auVar80._24_4_ * 0.0;
    auVar28._28_4_ = fVar209;
    auVar29._4_4_ = fVar222 * auVar82._4_4_;
    auVar29._0_4_ = fVar221 * auVar82._0_4_;
    auVar29._8_4_ = fVar223 * auVar82._8_4_;
    auVar29._12_4_ = fVar224 * auVar82._12_4_;
    auVar29._16_4_ = auVar82._16_4_ * 0.0;
    auVar29._20_4_ = auVar82._20_4_ * 0.0;
    auVar29._24_4_ = auVar82._24_4_ * 0.0;
    auVar29._28_4_ = auVar92._28_4_;
    auVar66 = vfmadd231ps_fma(auVar28,auVar81,ZEXT1632(auVar66));
    auVar67 = vfmadd231ps_fma(auVar29,auVar81,ZEXT1632(auVar67));
    auVar125._0_4_ = fVar221 * auVar83._0_4_;
    auVar125._4_4_ = fVar222 * auVar83._4_4_;
    auVar125._8_4_ = fVar223 * auVar83._8_4_;
    auVar125._12_4_ = fVar224 * auVar83._12_4_;
    auVar125._16_4_ = auVar83._16_4_ * 0.0;
    auVar125._20_4_ = auVar83._20_4_ * 0.0;
    auVar125._24_4_ = auVar83._24_4_ * 0.0;
    auVar125._28_4_ = 0;
    auVar30._4_4_ = fVar222 * auVar84._4_4_;
    auVar30._0_4_ = fVar221 * auVar84._0_4_;
    auVar30._8_4_ = fVar223 * auVar84._8_4_;
    auVar30._12_4_ = fVar224 * auVar84._12_4_;
    auVar30._16_4_ = auVar84._16_4_ * 0.0;
    auVar30._20_4_ = auVar84._20_4_ * 0.0;
    auVar30._24_4_ = auVar84._24_4_ * 0.0;
    auVar30._28_4_ = auVar83._28_4_;
    auVar72 = vfmadd231ps_fma(auVar125,auVar81,auVar80);
    auVar73 = vfmadd231ps_fma(auVar30,auVar81,auVar82);
    auVar31._28_4_ = auVar82._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * auVar73._12_4_,
                            CONCAT48(fVar223 * auVar73._8_4_,
                                     CONCAT44(fVar222 * auVar73._4_4_,fVar221 * auVar73._0_4_))));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar72._12_4_,
                                                 CONCAT48(fVar223 * auVar72._8_4_,
                                                          CONCAT44(fVar222 * auVar72._4_4_,
                                                                   fVar221 * auVar72._0_4_)))),
                              auVar81,ZEXT1632(auVar66));
    auVar55 = vfmadd231ps_fma(auVar31,auVar81,ZEXT1632(auVar67));
    auVar80 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar66));
    auVar92 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar67));
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar80 = vmulps_avx512vl(auVar80,auVar82);
    auVar92 = vmulps_avx512vl(auVar92,auVar82);
    auVar200._0_4_ = fVar111 * auVar80._0_4_;
    auVar200._4_4_ = fVar111 * auVar80._4_4_;
    auVar200._8_4_ = fVar111 * auVar80._8_4_;
    auVar200._12_4_ = fVar111 * auVar80._12_4_;
    auVar200._16_4_ = fVar111 * auVar80._16_4_;
    auVar200._20_4_ = fVar111 * auVar80._20_4_;
    auVar200._24_4_ = fVar111 * auVar80._24_4_;
    auVar200._28_4_ = 0;
    auVar80 = vmulps_avx512vl(auVar207,auVar92);
    auVar72 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
    auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_0205fd20,ZEXT1632(auVar72));
    auVar83 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_0205fd20,ZEXT1632(auVar72));
    auVar126._0_4_ = auVar200._0_4_ + auVar75._0_4_;
    auVar126._4_4_ = auVar200._4_4_ + auVar75._4_4_;
    auVar126._8_4_ = auVar200._8_4_ + auVar75._8_4_;
    auVar126._12_4_ = auVar200._12_4_ + auVar75._12_4_;
    auVar126._16_4_ = auVar200._16_4_ + 0.0;
    auVar126._20_4_ = auVar200._20_4_ + 0.0;
    auVar126._24_4_ = auVar200._24_4_ + 0.0;
    auVar126._28_4_ = 0;
    auVar95 = ZEXT1632(auVar72);
    auVar84 = vpermt2ps_avx512vl(auVar200,_DAT_0205fd20,auVar95);
    auVar85 = vaddps_avx512vl(ZEXT1632(auVar55),auVar80);
    auVar86 = vpermt2ps_avx512vl(auVar80,_DAT_0205fd20,auVar95);
    auVar80 = vsubps_avx(auVar92,auVar84);
    auVar84 = vsubps_avx512vl(auVar83,auVar86);
    auVar86 = vmulps_avx512vl(auVar93,auVar91);
    auVar79 = vmulps_avx512vl(auVar77,auVar91);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,auVar87);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar88);
    auVar87 = vmulps_avx512vl(auVar94,auVar91);
    auVar88 = vmulps_avx512vl(auVar78,auVar91);
    auVar93 = vfmadd231ps_avx512vl(auVar87,auVar81,auVar93);
    auVar87 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar77);
    auVar88 = vmulps_avx512vl(auVar89,auVar91);
    auVar77 = vmulps_avx512vl(auVar90,auVar91);
    auVar66 = vfmadd231ps_fma(auVar88,auVar81,auVar94);
    auVar67 = vfmadd231ps_fma(auVar77,auVar81,auVar78);
    auVar88 = vmulps_avx512vl(auVar91,auVar93);
    auVar77 = vmulps_avx512vl(ZEXT1632(auVar70),auVar87);
    auVar86 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar86);
    auVar79 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar79);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar66._12_4_,
                                            CONCAT48(fVar223 * auVar66._8_4_,
                                                     CONCAT44(fVar222 * auVar66._4_4_,
                                                              fVar221 * auVar66._0_4_)))),auVar81,
                         auVar93);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar67._12_4_,
                                            CONCAT48(fVar223 * auVar67._8_4_,
                                                     CONCAT44(fVar222 * auVar67._4_4_,
                                                              fVar221 * auVar67._0_4_)))),auVar81,
                         auVar87);
    auVar32._4_4_ = fVar222 * auVar93._4_4_;
    auVar32._0_4_ = fVar221 * auVar93._0_4_;
    auVar32._8_4_ = fVar223 * auVar93._8_4_;
    auVar32._12_4_ = fVar224 * auVar93._12_4_;
    auVar32._16_4_ = auVar93._16_4_ * 0.0;
    auVar32._20_4_ = auVar93._20_4_ * 0.0;
    auVar32._24_4_ = auVar93._24_4_ * 0.0;
    auVar32._28_4_ = auVar78._28_4_;
    auVar33._4_4_ = fVar222 * auVar87._4_4_;
    auVar33._0_4_ = fVar221 * auVar87._0_4_;
    auVar33._8_4_ = fVar223 * auVar87._8_4_;
    auVar33._12_4_ = fVar224 * auVar87._12_4_;
    auVar33._16_4_ = auVar87._16_4_ * 0.0;
    auVar33._20_4_ = auVar87._20_4_ * 0.0;
    auVar33._24_4_ = auVar87._24_4_ * 0.0;
    auVar33._28_4_ = auVar94._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar32,auVar81,auVar86);
    auVar88 = vfmadd231ps_avx512vl(auVar33,auVar79,auVar81);
    auVar81 = vsubps_avx512vl(auVar93,auVar86);
    auVar93 = vsubps_avx512vl(auVar87,auVar79);
    auVar81 = vmulps_avx512vl(auVar81,auVar82);
    auVar93 = vmulps_avx512vl(auVar93,auVar82);
    fVar209 = fVar111 * auVar81._0_4_;
    fVar221 = fVar111 * auVar81._4_4_;
    auVar34._4_4_ = fVar221;
    auVar34._0_4_ = fVar209;
    fVar222 = fVar111 * auVar81._8_4_;
    auVar34._8_4_ = fVar222;
    fVar223 = fVar111 * auVar81._12_4_;
    auVar34._12_4_ = fVar223;
    fVar224 = fVar111 * auVar81._16_4_;
    auVar34._16_4_ = fVar224;
    fVar136 = fVar111 * auVar81._20_4_;
    auVar34._20_4_ = fVar136;
    fVar111 = fVar111 * auVar81._24_4_;
    auVar34._24_4_ = fVar111;
    auVar34._28_4_ = auVar81._28_4_;
    auVar93 = vmulps_avx512vl(auVar207,auVar93);
    auVar82 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar95);
    auVar86 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar95);
    auVar208._0_4_ = auVar94._0_4_ + fVar209;
    auVar208._4_4_ = auVar94._4_4_ + fVar221;
    auVar208._8_4_ = auVar94._8_4_ + fVar222;
    auVar208._12_4_ = auVar94._12_4_ + fVar223;
    auVar208._16_4_ = auVar94._16_4_ + fVar224;
    auVar208._20_4_ = auVar94._20_4_ + fVar136;
    auVar208._24_4_ = auVar94._24_4_ + fVar111;
    auVar208._28_4_ = auVar94._28_4_ + auVar81._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar34,_DAT_0205fd20,ZEXT1632(auVar72));
    auVar79 = vaddps_avx512vl(auVar88,auVar93);
    auVar93 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,ZEXT1632(auVar72));
    auVar81 = vsubps_avx(auVar82,auVar81);
    auVar93 = vsubps_avx512vl(auVar86,auVar93);
    auVar145 = ZEXT1632(auVar75);
    auVar87 = vsubps_avx512vl(auVar94,auVar145);
    auVar152 = ZEXT1632(auVar55);
    auVar77 = vsubps_avx512vl(auVar88,auVar152);
    auVar78 = vsubps_avx512vl(auVar82,auVar92);
    auVar87 = vaddps_avx512vl(auVar87,auVar78);
    auVar78 = vsubps_avx512vl(auVar86,auVar83);
    auVar77 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vmulps_avx512vl(auVar152,auVar87);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar145,auVar77);
    auVar89 = vmulps_avx512vl(auVar85,auVar87);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar126,auVar77);
    auVar90 = vmulps_avx512vl(auVar84,auVar87);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar80,auVar77);
    auVar91 = vmulps_avx512vl(auVar83,auVar87);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar92,auVar77);
    auVar95 = vmulps_avx512vl(auVar88,auVar87);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar94,auVar77);
    auVar96 = vmulps_avx512vl(auVar79,auVar87);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar208,auVar77);
    auVar97 = vmulps_avx512vl(auVar93,auVar87);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar81,auVar77);
    auVar87 = vmulps_avx512vl(auVar86,auVar87);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar82,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar89);
    auVar78 = vmaxps_avx512vl(auVar78,auVar89);
    auVar89 = vminps_avx512vl(auVar90,auVar91);
    auVar77 = vminps_avx512vl(auVar77,auVar89);
    auVar89 = vmaxps_avx512vl(auVar90,auVar91);
    auVar78 = vmaxps_avx512vl(auVar78,auVar89);
    auVar89 = vminps_avx512vl(auVar95,auVar96);
    auVar90 = vmaxps_avx512vl(auVar95,auVar96);
    auVar91 = vminps_avx512vl(auVar97,auVar87);
    auVar89 = vminps_avx512vl(auVar89,auVar91);
    auVar77 = vminps_avx512vl(auVar77,auVar89);
    auVar87 = vmaxps_avx512vl(auVar97,auVar87);
    auVar87 = vmaxps_avx512vl(auVar90,auVar87);
    auVar87 = vmaxps_avx512vl(auVar78,auVar87);
    auVar70 = auVar87._0_16_;
    uVar22 = vcmpps_avx512vl(auVar77,local_1c0,2);
    uVar23 = vcmpps_avx512vl(auVar87,local_1e0,5);
    uVar47 = 0;
    bVar42 = (byte)uVar22 & (byte)uVar23 & 0x7f;
    if (bVar42 != 0) {
      auVar87 = vsubps_avx512vl(auVar92,auVar145);
      auVar77 = vsubps_avx512vl(auVar83,auVar152);
      auVar78 = vsubps_avx512vl(auVar82,auVar94);
      auVar87 = vaddps_avx512vl(auVar87,auVar78);
      auVar70 = auVar87._0_16_;
      auVar78 = vsubps_avx512vl(auVar86,auVar88);
      auVar77 = vaddps_avx512vl(auVar77,auVar78);
      auVar78 = vmulps_avx512vl(auVar152,auVar87);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar77,auVar145);
      auVar85 = vmulps_avx512vl(auVar85,auVar87);
      auVar85 = vfnmadd213ps_avx512vl(auVar126,auVar77,auVar85);
      auVar84 = vmulps_avx512vl(auVar84,auVar87);
      auVar84 = vfnmadd213ps_avx512vl(auVar80,auVar77,auVar84);
      auVar80 = vmulps_avx512vl(auVar83,auVar87);
      auVar83 = vfnmadd231ps_avx512vl(auVar80,auVar77,auVar92);
      auVar80 = vmulps_avx512vl(auVar88,auVar87);
      auVar94 = vfnmadd231ps_avx512vl(auVar80,auVar77,auVar94);
      auVar80 = vmulps_avx512vl(auVar79,auVar87);
      auVar79 = vfnmadd213ps_avx512vl(auVar208,auVar77,auVar80);
      auVar80 = vmulps_avx512vl(auVar93,auVar87);
      auVar88 = vfnmadd213ps_avx512vl(auVar81,auVar77,auVar80);
      auVar81 = vmulps_avx512vl(auVar86,auVar87);
      auVar82 = vfnmadd231ps_avx512vl(auVar81,auVar82,auVar77);
      auVar80 = vminps_avx(auVar78,auVar85);
      auVar81 = vmaxps_avx(auVar78,auVar85);
      auVar92 = vminps_avx(auVar84,auVar83);
      auVar92 = vminps_avx(auVar80,auVar92);
      auVar80 = vmaxps_avx(auVar84,auVar83);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      auVar93 = vminps_avx(auVar94,auVar79);
      auVar80 = vmaxps_avx(auVar94,auVar79);
      auVar94 = vminps_avx(auVar88,auVar82);
      auVar93 = vminps_avx(auVar93,auVar94);
      auVar93 = vminps_avx(auVar92,auVar93);
      auVar92 = vmaxps_avx(auVar88,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar92);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      uVar22 = vcmpps_avx512vl(auVar81,local_1e0,5);
      uVar23 = vcmpps_avx512vl(auVar93,local_1c0,2);
      uVar47 = (uint)(bVar42 & (byte)uVar22 & (byte)uVar23);
    }
    if (uVar47 != 0) {
      auStack_410[uVar44] = uVar47;
      uVar22 = vmovlps_avx(auVar53);
      *(undefined8 *)(&uStack_280 + uVar44 * 2) = uVar22;
      uVar50 = vmovlps_avx512f(auVar58);
      auStack_1a0[uVar44] = uVar50;
      uVar44 = (ulong)((int)uVar44 + 1);
    }
    auVar53 = vxorps_avx512vl(auVar70,auVar70);
    auVar266 = ZEXT1664(auVar53);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar271 = ZEXT1664(auVar53);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar267 = ZEXT3264(auVar81);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar268 = ZEXT1664(auVar53);
    do {
      auVar53 = auVar266._0_16_;
      if ((int)uVar44 == 0) {
        uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar27._4_4_ = uVar112;
        auVar27._0_4_ = uVar112;
        auVar27._8_4_ = uVar112;
        auVar27._12_4_ = uVar112;
        auVar27._16_4_ = uVar112;
        auVar27._20_4_ = uVar112;
        auVar27._24_4_ = uVar112;
        auVar27._28_4_ = uVar112;
        uVar22 = vcmpps_avx512vl(local_200,auVar27,2);
        uVar51 = (uint)uVar52 & (uint)uVar52 + 0xff & (uint)uVar22;
        uVar52 = (ulong)uVar51;
        if (uVar51 == 0) {
          return;
        }
        goto LAB_01ec11e2;
      }
      uVar43 = (int)uVar44 - 1;
      uVar45 = (ulong)uVar43;
      uVar47 = (&uStack_280)[uVar45 * 2];
      fVar111 = afStack_27c[uVar45 * 2];
      uVar7 = auStack_410[uVar45];
      auVar262._8_8_ = 0;
      auVar262._0_8_ = auStack_1a0[uVar45];
      auVar264 = ZEXT1664(auVar262);
      lVar48 = 0;
      for (uVar50 = (ulong)uVar7; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
        lVar48 = lVar48 + 1;
      }
      uVar49 = uVar7 - 1 & uVar7;
      auStack_410[uVar45] = uVar49;
      if (uVar49 == 0) {
        uVar44 = (ulong)uVar43;
      }
      auVar128._0_4_ = (float)lVar48;
      auVar128._4_8_ = SUB128(ZEXT812(0),4);
      auVar128._12_4_ = 0;
      auVar70 = vmulss_avx512f(auVar128,SUB6416(ZEXT464(0x3e124925),0));
      lVar48 = lVar48 + 1;
      auVar66 = vmulss_avx512f(ZEXT416((uint)(float)lVar48),SUB6416(ZEXT464(0x3e124925),0));
      auVar72 = auVar269._0_16_;
      auVar67 = vsubss_avx512f(auVar72,auVar70);
      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * auVar70._0_4_)),ZEXT416(uVar47),auVar67);
      auVar67 = vsubss_avx512f(auVar72,auVar66);
      auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * auVar66._0_4_)),ZEXT416(uVar47),auVar67);
      fVar209 = auVar66._0_4_;
      fVar221 = auVar70._0_4_;
      fVar111 = fVar209 - fVar221;
      vucomiss_avx512f(ZEXT416((uint)fVar111));
      if (uVar7 == 0 || lVar48 == 0) break;
      auVar67 = vshufps_avx(auVar262,auVar262,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar111));
      auVar113 = auVar268._0_16_;
      auVar55 = vsubps_avx512vl(auVar113,auVar67);
      fVar222 = auVar67._0_4_;
      auVar139._0_4_ = fVar115 * fVar222;
      fVar223 = auVar67._4_4_;
      auVar139._4_4_ = fVar116 * fVar223;
      fVar224 = auVar67._8_4_;
      auVar139._8_4_ = fVar115 * fVar224;
      fVar136 = auVar67._12_4_;
      auVar139._12_4_ = fVar116 * fVar136;
      auVar149._0_4_ = fVar225 * fVar222;
      auVar149._4_4_ = fVar232 * fVar223;
      auVar149._8_4_ = fVar225 * fVar224;
      auVar149._12_4_ = fVar232 * fVar136;
      auVar156._0_4_ = fVar233 * fVar222;
      auVar156._4_4_ = fVar243 * fVar223;
      auVar156._8_4_ = fVar233 * fVar224;
      auVar156._12_4_ = fVar243 * fVar136;
      auVar120._0_4_ = fVar251 * fVar222;
      auVar120._4_4_ = fVar259 * fVar223;
      auVar120._8_4_ = fVar251 * fVar224;
      auVar120._12_4_ = fVar259 * fVar136;
      auVar67 = vfmadd231ps_fma(auVar139,auVar55,local_420);
      auVar73 = vfmadd231ps_fma(auVar149,auVar55,local_430);
      auVar75 = vfmadd231ps_fma(auVar156,auVar55,local_440);
      auVar55 = vfmadd231ps_fma(auVar120,auVar164,auVar55);
      auVar135._16_16_ = auVar67;
      auVar135._0_16_ = auVar67;
      auVar146._16_16_ = auVar73;
      auVar146._0_16_ = auVar73;
      auVar153._16_16_ = auVar75;
      auVar153._0_16_ = auVar75;
      auVar169._4_4_ = fVar221;
      auVar169._0_4_ = fVar221;
      auVar169._8_4_ = fVar221;
      auVar169._12_4_ = fVar221;
      auVar169._20_4_ = fVar209;
      auVar169._16_4_ = fVar209;
      auVar169._24_4_ = fVar209;
      auVar169._28_4_ = fVar209;
      auVar81 = vsubps_avx(auVar146,auVar135);
      auVar73 = vfmadd213ps_fma(auVar81,auVar169,auVar135);
      auVar81 = vsubps_avx(auVar153,auVar146);
      auVar58 = vfmadd213ps_fma(auVar81,auVar169,auVar146);
      auVar67 = vsubps_avx(auVar55,auVar75);
      auVar147._16_16_ = auVar67;
      auVar147._0_16_ = auVar67;
      auVar67 = vfmadd213ps_fma(auVar147,auVar169,auVar153);
      auVar81 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar73));
      auVar73 = vfmadd213ps_fma(auVar81,auVar169,ZEXT1632(auVar73));
      auVar81 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar58));
      auVar67 = vfmadd213ps_fma(auVar81,auVar169,ZEXT1632(auVar58));
      auVar81 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar73));
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar81,auVar169);
      auVar81 = vmulps_avx512vl(auVar81,auVar267._0_32_);
      auVar99._16_16_ = auVar81._16_16_;
      auVar67 = vmulss_avx512f(ZEXT416((uint)fVar111),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar209 = auVar67._0_4_;
      auVar157._0_8_ =
           CONCAT44(auVar71._4_4_ + fVar209 * auVar81._4_4_,auVar71._0_4_ + fVar209 * auVar81._0_4_)
      ;
      auVar157._8_4_ = auVar71._8_4_ + fVar209 * auVar81._8_4_;
      auVar157._12_4_ = auVar71._12_4_ + fVar209 * auVar81._12_4_;
      auVar140._0_4_ = fVar209 * auVar81._16_4_;
      auVar140._4_4_ = fVar209 * auVar81._20_4_;
      auVar140._8_4_ = fVar209 * auVar81._24_4_;
      auVar140._12_4_ = fVar209 * auVar81._28_4_;
      auVar63 = vsubps_avx((undefined1  [16])0x0,auVar140);
      auVar57 = vshufpd_avx(auVar71,auVar71,3);
      auVar59 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar67 = vsubps_avx(auVar57,auVar71);
      auVar73 = vsubps_avx(auVar59,(undefined1  [16])0x0);
      auVar172._0_4_ = auVar73._0_4_ + auVar67._0_4_;
      auVar172._4_4_ = auVar73._4_4_ + auVar67._4_4_;
      auVar172._8_4_ = auVar73._8_4_ + auVar67._8_4_;
      auVar172._12_4_ = auVar73._12_4_ + auVar67._12_4_;
      auVar67 = vshufps_avx(auVar71,auVar71,0xb1);
      auVar73 = vshufps_avx(auVar157,auVar157,0xb1);
      auVar75 = vshufps_avx(auVar63,auVar63,0xb1);
      auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar236._4_4_ = auVar172._0_4_;
      auVar236._0_4_ = auVar172._0_4_;
      auVar236._8_4_ = auVar172._0_4_;
      auVar236._12_4_ = auVar172._0_4_;
      auVar58 = vshufps_avx(auVar172,auVar172,0x55);
      fVar209 = auVar58._0_4_;
      auVar189._0_4_ = auVar67._0_4_ * fVar209;
      fVar221 = auVar58._4_4_;
      auVar189._4_4_ = auVar67._4_4_ * fVar221;
      fVar222 = auVar58._8_4_;
      auVar189._8_4_ = auVar67._8_4_ * fVar222;
      fVar223 = auVar58._12_4_;
      auVar189._12_4_ = auVar67._12_4_ * fVar223;
      auVar204._0_4_ = auVar73._0_4_ * fVar209;
      auVar204._4_4_ = auVar73._4_4_ * fVar221;
      auVar204._8_4_ = auVar73._8_4_ * fVar222;
      auVar204._12_4_ = auVar73._12_4_ * fVar223;
      auVar213._0_4_ = auVar75._0_4_ * fVar209;
      auVar213._4_4_ = auVar75._4_4_ * fVar221;
      auVar213._8_4_ = auVar75._8_4_ * fVar222;
      auVar213._12_4_ = auVar75._12_4_ * fVar223;
      auVar173._0_4_ = auVar55._0_4_ * fVar209;
      auVar173._4_4_ = auVar55._4_4_ * fVar221;
      auVar173._8_4_ = auVar55._8_4_ * fVar222;
      auVar173._12_4_ = auVar55._12_4_ * fVar223;
      auVar67 = vfmadd231ps_fma(auVar189,auVar236,auVar71);
      auVar73 = vfmadd231ps_fma(auVar204,auVar236,auVar157);
      auVar58 = vfmadd231ps_fma(auVar213,auVar236,auVar63);
      auVar64 = vfmadd231ps_fma(auVar173,(undefined1  [16])0x0,auVar236);
      auVar56 = vshufpd_avx(auVar67,auVar67,1);
      auVar60 = vshufpd_avx(auVar73,auVar73,1);
      auVar61 = vshufpd_avx(auVar58,auVar58,1);
      auVar62 = vshufpd_avx(auVar64,auVar64,1);
      auVar75 = vminss_avx(auVar67,auVar73);
      auVar67 = vmaxss_avx(auVar73,auVar67);
      auVar55 = vminss_avx(auVar58,auVar64);
      auVar73 = vmaxss_avx(auVar64,auVar58);
      auVar55 = vminss_avx(auVar75,auVar55);
      auVar67 = vmaxss_avx(auVar73,auVar67);
      auVar58 = vminss_avx(auVar56,auVar60);
      auVar73 = vmaxss_avx(auVar60,auVar56);
      auVar56 = vminss_avx(auVar61,auVar62);
      auVar75 = vmaxss_avx(auVar62,auVar61);
      auVar58 = vminss_avx(auVar58,auVar56);
      auVar73 = vmaxss_avx(auVar75,auVar73);
      vucomiss_avx512f(auVar55);
      fVar221 = auVar73._0_4_;
      fVar209 = auVar67._0_4_;
      if (((uint)uVar44 < 5) || (fVar221 <= -0.0001)) {
        uVar22 = vcmpps_avx512vl(auVar58,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar23 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar209 & ((byte)uVar23 | (byte)uVar22)) != 0) goto LAB_01ec2516;
        uVar22 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar73,5);
        uVar23 = vcmpps_avx512vl(auVar58,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar23 | (ushort)uVar22) & 1) == 0) goto LAB_01ec2516;
LAB_01ec2fb6:
        bVar14 = true;
        auVar264 = ZEXT1664(auVar262);
      }
      else {
LAB_01ec2516:
        uVar22 = vcmpss_avx512f(auVar55,auVar53,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        iVar110 = auVar269._0_4_;
        fVar222 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar110);
        uVar22 = vcmpss_avx512f(auVar67,auVar53,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        fVar223 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar110);
        bVar14 = fVar222 != fVar223;
        iVar265 = auVar266._0_4_;
        auVar99._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar14 * iVar265 + (uint)!bVar14 * 0x7f800000;
        auVar56 = auVar98._0_16_;
        auVar101._16_16_ = auVar99._16_16_;
        auVar101._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar14 * iVar265 + (uint)!bVar14 * -0x800000;
        auVar75 = auVar100._0_16_;
        uVar22 = vcmpss_avx512f(auVar58,auVar53,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        fVar224 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar110);
        if ((fVar222 != fVar224) || (NAN(fVar222) || NAN(fVar224))) {
          fVar136 = auVar58._0_4_;
          fVar222 = auVar55._0_4_;
          bVar14 = fVar136 == fVar222;
          if ((!bVar14) || (NAN(fVar136) || NAN(fVar222))) {
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar55 = vxorps_avx512vl(auVar55,auVar26);
            auVar253._0_4_ = auVar55._0_4_ / (fVar136 - fVar222);
            auVar253._4_12_ = auVar55._4_12_;
            auVar55 = vsubss_avx512f(auVar72,auVar253);
            auVar58 = vfmadd213ss_avx512f(auVar55,auVar53,auVar253);
            auVar55 = auVar58;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar103._16_16_ = auVar99._16_16_;
            auVar103._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar102._4_28_ = auVar103._4_28_;
            auVar102._0_4_ = (uint)bVar14 * iVar265 + (uint)!bVar14 * 0x7f800000;
            auVar58 = auVar102._0_16_;
            auVar55 = ZEXT416((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x800000);
          }
          auVar56 = vminss_avx(auVar56,auVar58);
          auVar75 = vmaxss_avx(auVar55,auVar75);
        }
        uVar22 = vcmpss_avx512f(auVar73,auVar53,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        fVar222 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar110);
        if ((fVar223 != fVar222) || (NAN(fVar223) || NAN(fVar222))) {
          bVar14 = fVar221 == fVar209;
          if ((!bVar14) || (NAN(fVar221) || NAN(fVar209))) {
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar67 = vxorps_avx512vl(auVar67,auVar25);
            auVar214._0_4_ = auVar67._0_4_ / (fVar221 - fVar209);
            auVar214._4_12_ = auVar67._4_12_;
            auVar67 = vsubss_avx512f(auVar72,auVar214);
            auVar73 = vfmadd213ss_avx512f(auVar67,auVar53,auVar214);
            auVar67 = auVar73;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar105._16_16_ = auVar99._16_16_;
            auVar105._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar104._4_28_ = auVar105._4_28_;
            auVar104._0_4_ = (uint)bVar14 * iVar265 + (uint)!bVar14 * 0x7f800000;
            auVar73 = auVar104._0_16_;
            auVar67 = ZEXT416((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x800000);
          }
          auVar56 = vminss_avx(auVar56,auVar73);
          auVar75 = vmaxss_avx(auVar67,auVar75);
        }
        bVar14 = fVar224 != fVar222;
        auVar67 = vminss_avx512f(auVar56,auVar72);
        auVar107._16_16_ = auVar99._16_16_;
        auVar107._0_16_ = auVar56;
        auVar106._4_28_ = auVar107._4_28_;
        auVar106._0_4_ = (uint)bVar14 * auVar67._0_4_ + (uint)!bVar14 * auVar56._0_4_;
        auVar67 = vmaxss_avx512f(auVar72,auVar75);
        auVar109._16_16_ = auVar99._16_16_;
        auVar109._0_16_ = auVar75;
        auVar108._4_28_ = auVar109._4_28_;
        auVar108._0_4_ = (uint)bVar14 * auVar67._0_4_ + (uint)!bVar14 * auVar75._0_4_;
        auVar67 = vmaxss_avx512f(auVar53,auVar106._0_16_);
        auVar73 = vminss_avx512f(auVar108._0_16_,auVar72);
        bVar14 = true;
        if (auVar73._0_4_ < auVar67._0_4_) goto LAB_01ec2fb6;
        auVar55 = vmaxss_avx512f(auVar53,ZEXT416((uint)(auVar67._0_4_ + -0.1)));
        auVar60 = vminss_avx512f(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar72);
        auVar121._0_8_ = auVar71._0_8_;
        auVar121._8_8_ = auVar121._0_8_;
        auVar205._8_8_ = auVar157._0_8_;
        auVar205._0_8_ = auVar157._0_8_;
        auVar215._8_8_ = auVar63._0_8_;
        auVar215._0_8_ = auVar63._0_8_;
        auVar67 = vshufpd_avx(auVar157,auVar157,3);
        auVar73 = vshufpd_avx(auVar63,auVar63,3);
        auVar75 = vshufps_avx(auVar55,auVar60,0);
        auVar61 = vsubps_avx512vl(auVar113,auVar75);
        fVar209 = auVar75._0_4_;
        auVar248._0_4_ = fVar209 * auVar57._0_4_;
        fVar221 = auVar75._4_4_;
        auVar248._4_4_ = fVar221 * auVar57._4_4_;
        fVar222 = auVar75._8_4_;
        auVar248._8_4_ = fVar222 * auVar57._8_4_;
        fVar223 = auVar75._12_4_;
        auVar248._12_4_ = fVar223 * auVar57._12_4_;
        auVar158._0_4_ = fVar209 * auVar67._0_4_;
        auVar158._4_4_ = fVar221 * auVar67._4_4_;
        auVar158._8_4_ = fVar222 * auVar67._8_4_;
        auVar158._12_4_ = fVar223 * auVar67._12_4_;
        auVar165._0_4_ = fVar209 * auVar73._0_4_;
        auVar165._4_4_ = fVar221 * auVar73._4_4_;
        auVar165._8_4_ = fVar222 * auVar73._8_4_;
        auVar165._12_4_ = fVar223 * auVar73._12_4_;
        auVar141._0_4_ = fVar209 * auVar59._0_4_;
        auVar141._4_4_ = fVar221 * auVar59._4_4_;
        auVar141._8_4_ = fVar222 * auVar59._8_4_;
        auVar141._12_4_ = fVar223 * auVar59._12_4_;
        auVar58 = vfmadd231ps_fma(auVar248,auVar61,auVar121);
        auVar56 = vfmadd231ps_fma(auVar158,auVar61,auVar205);
        auVar57 = vfmadd231ps_fma(auVar165,auVar61,auVar215);
        auVar59 = vfmadd231ps_fma(auVar141,auVar61,ZEXT816(0));
        auVar73 = vsubss_avx512f(auVar72,auVar55);
        auVar67 = vmovshdup_avx(auVar262);
        auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar55._0_4_)),auVar262,auVar73);
        auVar73 = vsubss_avx512f(auVar72,auVar60);
        auVar162 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar67._0_4_)),auVar262,auVar73);
        auVar60 = vdivss_avx512f(auVar72,ZEXT416((uint)fVar111));
        auVar67 = vsubps_avx(auVar56,auVar58);
        auVar129._0_4_ = auVar67._0_4_ * 3.0;
        auVar129._4_4_ = auVar67._4_4_ * 3.0;
        auVar129._8_4_ = auVar67._8_4_ * 3.0;
        auVar129._12_4_ = auVar67._12_4_ * 3.0;
        auVar67 = vsubps_avx(auVar57,auVar56);
        auVar174._0_4_ = auVar67._0_4_ * 3.0;
        auVar174._4_4_ = auVar67._4_4_ * 3.0;
        auVar174._8_4_ = auVar67._8_4_ * 3.0;
        auVar174._12_4_ = auVar67._12_4_ * 3.0;
        auVar67 = vsubps_avx(auVar59,auVar57);
        auVar190._0_4_ = auVar67._0_4_ * 3.0;
        auVar190._4_4_ = auVar67._4_4_ * 3.0;
        auVar190._8_4_ = auVar67._8_4_ * 3.0;
        auVar190._12_4_ = auVar67._12_4_ * 3.0;
        auVar73 = vminps_avx(auVar174,auVar190);
        auVar67 = vmaxps_avx(auVar174,auVar190);
        auVar73 = vminps_avx(auVar129,auVar73);
        auVar67 = vmaxps_avx(auVar129,auVar67);
        auVar75 = vshufpd_avx(auVar73,auVar73,3);
        auVar55 = vshufpd_avx(auVar67,auVar67,3);
        auVar73 = vminps_avx(auVar73,auVar75);
        auVar67 = vmaxps_avx(auVar67,auVar55);
        fVar111 = auVar60._0_4_;
        auVar191._0_4_ = fVar111 * auVar73._0_4_;
        auVar191._4_4_ = fVar111 * auVar73._4_4_;
        auVar191._8_4_ = fVar111 * auVar73._8_4_;
        auVar191._12_4_ = fVar111 * auVar73._12_4_;
        auVar175._0_4_ = fVar111 * auVar67._0_4_;
        auVar175._4_4_ = fVar111 * auVar67._4_4_;
        auVar175._8_4_ = fVar111 * auVar67._8_4_;
        auVar175._12_4_ = fVar111 * auVar67._12_4_;
        auVar60 = vdivss_avx512f(auVar72,ZEXT416((uint)(auVar162._0_4_ - auVar71._0_4_)));
        auVar67 = vshufpd_avx(auVar58,auVar58,3);
        auVar73 = vshufpd_avx(auVar56,auVar56,3);
        auVar75 = vshufpd_avx(auVar57,auVar57,3);
        auVar55 = vshufpd_avx(auVar59,auVar59,3);
        auVar67 = vsubps_avx(auVar67,auVar58);
        auVar58 = vsubps_avx(auVar73,auVar56);
        auVar56 = vsubps_avx(auVar75,auVar57);
        auVar55 = vsubps_avx(auVar55,auVar59);
        auVar73 = vminps_avx(auVar67,auVar58);
        auVar67 = vmaxps_avx(auVar67,auVar58);
        auVar75 = vminps_avx(auVar56,auVar55);
        auVar75 = vminps_avx(auVar73,auVar75);
        auVar73 = vmaxps_avx(auVar56,auVar55);
        auVar67 = vmaxps_avx(auVar67,auVar73);
        fVar111 = auVar60._0_4_;
        auVar216._0_4_ = fVar111 * auVar75._0_4_;
        auVar216._4_4_ = fVar111 * auVar75._4_4_;
        auVar216._8_4_ = fVar111 * auVar75._8_4_;
        auVar216._12_4_ = fVar111 * auVar75._12_4_;
        auVar227._0_4_ = fVar111 * auVar67._0_4_;
        auVar227._4_4_ = fVar111 * auVar67._4_4_;
        auVar227._8_4_ = fVar111 * auVar67._8_4_;
        auVar227._12_4_ = fVar111 * auVar67._12_4_;
        auVar64 = vinsertps_avx512f(auVar70,auVar71,0x10);
        auVar58 = vinsertps_avx(auVar66,auVar162,0x10);
        auVar114._0_4_ = auVar64._0_4_ + auVar58._0_4_;
        auVar114._4_4_ = auVar64._4_4_ + auVar58._4_4_;
        auVar114._8_4_ = auVar64._8_4_ + auVar58._8_4_;
        auVar114._12_4_ = auVar64._12_4_ + auVar58._12_4_;
        auVar62 = vmulps_avx512vl(auVar114,auVar271._0_16_);
        auVar75 = vshufps_avx(auVar62,auVar62,0x54);
        uVar112 = auVar62._0_4_;
        auVar130._4_4_ = uVar112;
        auVar130._0_4_ = uVar112;
        auVar130._8_4_ = uVar112;
        auVar130._12_4_ = uVar112;
        auVar55 = vfmadd213ps_avx512vl(auVar54,auVar130,auVar69);
        auVar56 = vfmadd213ps_avx512vl(local_290,auVar130,auVar65);
        auVar73 = vfmadd213ps_fma(local_2a0,auVar130,auVar68);
        auVar67 = vsubps_avx(auVar56,auVar55);
        auVar55 = vfmadd213ps_fma(auVar67,auVar130,auVar55);
        auVar67 = vsubps_avx(auVar73,auVar56);
        auVar67 = vfmadd213ps_fma(auVar67,auVar130,auVar56);
        auVar67 = vsubps_avx(auVar67,auVar55);
        auVar73 = vfmadd231ps_fma(auVar55,auVar67,auVar130);
        auVar131._0_8_ = CONCAT44(auVar67._4_4_ * 3.0,auVar67._0_4_ * 3.0);
        auVar131._8_4_ = auVar67._8_4_ * 3.0;
        auVar131._12_4_ = auVar67._12_4_ * 3.0;
        auVar237._8_8_ = auVar73._0_8_;
        auVar237._0_8_ = auVar73._0_8_;
        auVar67 = vshufpd_avx(auVar73,auVar73,3);
        auVar73 = vshufps_avx(auVar62,auVar62,0x55);
        auVar55 = vsubps_avx(auVar67,auVar237);
        auVar56 = vfmadd231ps_fma(auVar237,auVar73,auVar55);
        auVar254._8_8_ = auVar131._0_8_;
        auVar254._0_8_ = auVar131._0_8_;
        auVar67 = vshufpd_avx(auVar131,auVar131,3);
        auVar67 = vsubps_avx(auVar67,auVar254);
        auVar73 = vfmadd213ps_fma(auVar67,auVar73,auVar254);
        auVar132._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
        auVar132._8_4_ = auVar55._8_4_ ^ 0x80000000;
        auVar132._12_4_ = auVar55._12_4_ ^ 0x80000000;
        auVar67 = vmovshdup_avx(auVar73);
        auVar255._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
        auVar255._8_4_ = auVar67._8_4_ ^ 0x80000000;
        auVar255._12_4_ = auVar67._12_4_ ^ 0x80000000;
        auVar57 = vmovshdup_avx512vl(auVar55);
        auVar59 = vpermt2ps_avx512vl(auVar255,ZEXT416(5),auVar55);
        auVar67 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar67._0_4_ * auVar55._0_4_)),auVar73,auVar57
                                     );
        auVar73 = vpermt2ps_avx512vl(auVar73,SUB6416(ZEXT464(4),0),auVar132);
        auVar142._0_4_ = auVar67._0_4_;
        auVar142._4_4_ = auVar142._0_4_;
        auVar142._8_4_ = auVar142._0_4_;
        auVar142._12_4_ = auVar142._0_4_;
        auVar67 = vdivps_avx(auVar59,auVar142);
        auVar73 = vdivps_avx(auVar73,auVar142);
        fVar209 = auVar56._0_4_;
        auVar55 = vshufps_avx(auVar56,auVar56,0x55);
        fVar111 = auVar73._0_4_;
        auVar238._0_4_ = fVar209 * auVar67._0_4_ + auVar55._0_4_ * fVar111;
        auVar238._4_4_ = fVar209 * auVar67._4_4_ + auVar55._4_4_ * auVar73._4_4_;
        auVar238._8_4_ = fVar209 * auVar67._8_4_ + auVar55._8_4_ * auVar73._8_4_;
        auVar238._12_4_ = fVar209 * auVar67._12_4_ + auVar55._12_4_ * auVar73._12_4_;
        auVar63 = vsubps_avx(auVar75,auVar238);
        auVar56 = vmovshdup_avx(auVar67);
        auVar75 = vinsertps_avx(auVar191,auVar216,0x1c);
        auVar256._0_4_ = auVar56._0_4_ * auVar75._0_4_;
        auVar256._4_4_ = auVar56._4_4_ * auVar75._4_4_;
        auVar256._8_4_ = auVar56._8_4_ * auVar75._8_4_;
        auVar256._12_4_ = auVar56._12_4_ * auVar75._12_4_;
        auVar55 = vinsertps_avx(auVar175,auVar227,0x1c);
        auVar239._0_4_ = auVar56._0_4_ * auVar55._0_4_;
        auVar239._4_4_ = auVar56._4_4_ * auVar55._4_4_;
        auVar239._8_4_ = auVar56._8_4_ * auVar55._8_4_;
        auVar239._12_4_ = auVar56._12_4_ * auVar55._12_4_;
        auVar61 = vminps_avx512vl(auVar256,auVar239);
        auVar59 = vmaxps_avx(auVar239,auVar256);
        auVar60 = vmovshdup_avx(auVar73);
        auVar56 = vinsertps_avx(auVar216,auVar191,0x4c);
        auVar217._0_4_ = auVar60._0_4_ * auVar56._0_4_;
        auVar217._4_4_ = auVar60._4_4_ * auVar56._4_4_;
        auVar217._8_4_ = auVar60._8_4_ * auVar56._8_4_;
        auVar217._12_4_ = auVar60._12_4_ * auVar56._12_4_;
        auVar57 = vinsertps_avx(auVar227,auVar175,0x4c);
        auVar228._0_4_ = auVar60._0_4_ * auVar57._0_4_;
        auVar228._4_4_ = auVar60._4_4_ * auVar57._4_4_;
        auVar228._8_4_ = auVar60._8_4_ * auVar57._8_4_;
        auVar228._12_4_ = auVar60._12_4_ * auVar57._12_4_;
        auVar60 = vminps_avx(auVar217,auVar228);
        auVar61 = vaddps_avx512vl(auVar61,auVar60);
        auVar60 = vmaxps_avx(auVar228,auVar217);
        auVar218._0_4_ = auVar59._0_4_ + auVar60._0_4_;
        auVar218._4_4_ = auVar59._4_4_ + auVar60._4_4_;
        auVar218._8_4_ = auVar59._8_4_ + auVar60._8_4_;
        auVar218._12_4_ = auVar59._12_4_ + auVar60._12_4_;
        auVar229._8_8_ = 0x3f80000000000000;
        auVar229._0_8_ = 0x3f80000000000000;
        auVar59 = vsubps_avx(auVar229,auVar218);
        auVar60 = vsubps_avx(auVar229,auVar61);
        auVar61 = vsubps_avx(auVar64,auVar62);
        auVar62 = vsubps_avx(auVar58,auVar62);
        fVar224 = auVar61._0_4_;
        auVar257._0_4_ = fVar224 * auVar59._0_4_;
        fVar136 = auVar61._4_4_;
        auVar257._4_4_ = fVar136 * auVar59._4_4_;
        fVar201 = auVar61._8_4_;
        auVar257._8_4_ = fVar201 * auVar59._8_4_;
        fVar202 = auVar61._12_4_;
        auVar257._12_4_ = fVar202 * auVar59._12_4_;
        auVar76 = vbroadcastss_avx512vl(auVar67);
        auVar75 = vmulps_avx512vl(auVar76,auVar75);
        auVar55 = vmulps_avx512vl(auVar76,auVar55);
        auVar76 = vminps_avx512vl(auVar75,auVar55);
        auVar75 = vmaxps_avx(auVar55,auVar75);
        auVar192._0_4_ = fVar111 * auVar56._0_4_;
        auVar192._4_4_ = fVar111 * auVar56._4_4_;
        auVar192._8_4_ = fVar111 * auVar56._8_4_;
        auVar192._12_4_ = fVar111 * auVar56._12_4_;
        auVar176._0_4_ = fVar111 * auVar57._0_4_;
        auVar176._4_4_ = fVar111 * auVar57._4_4_;
        auVar176._8_4_ = fVar111 * auVar57._8_4_;
        auVar176._12_4_ = fVar111 * auVar57._12_4_;
        auVar55 = vminps_avx(auVar192,auVar176);
        auVar56 = vaddps_avx512vl(auVar76,auVar55);
        auVar57 = vmulps_avx512vl(auVar61,auVar60);
        fVar209 = auVar62._0_4_;
        auVar219._0_4_ = fVar209 * auVar59._0_4_;
        fVar221 = auVar62._4_4_;
        auVar219._4_4_ = fVar221 * auVar59._4_4_;
        fVar222 = auVar62._8_4_;
        auVar219._8_4_ = fVar222 * auVar59._8_4_;
        fVar223 = auVar62._12_4_;
        auVar219._12_4_ = fVar223 * auVar59._12_4_;
        auVar230._0_4_ = fVar209 * auVar60._0_4_;
        auVar230._4_4_ = fVar221 * auVar60._4_4_;
        auVar230._8_4_ = fVar222 * auVar60._8_4_;
        auVar230._12_4_ = fVar223 * auVar60._12_4_;
        auVar55 = vmaxps_avx(auVar176,auVar192);
        auVar177._0_4_ = auVar75._0_4_ + auVar55._0_4_;
        auVar177._4_4_ = auVar75._4_4_ + auVar55._4_4_;
        auVar177._8_4_ = auVar75._8_4_ + auVar55._8_4_;
        auVar177._12_4_ = auVar75._12_4_ + auVar55._12_4_;
        auVar193._8_8_ = 0x3f800000;
        auVar193._0_8_ = 0x3f800000;
        auVar75 = vsubps_avx(auVar193,auVar177);
        auVar55 = vsubps_avx(auVar193,auVar56);
        auVar249._0_4_ = fVar224 * auVar75._0_4_;
        auVar249._4_4_ = fVar136 * auVar75._4_4_;
        auVar249._8_4_ = fVar201 * auVar75._8_4_;
        auVar249._12_4_ = fVar202 * auVar75._12_4_;
        auVar240._0_4_ = fVar224 * auVar55._0_4_;
        auVar240._4_4_ = fVar136 * auVar55._4_4_;
        auVar240._8_4_ = fVar201 * auVar55._8_4_;
        auVar240._12_4_ = fVar202 * auVar55._12_4_;
        auVar178._0_4_ = fVar209 * auVar75._0_4_;
        auVar178._4_4_ = fVar221 * auVar75._4_4_;
        auVar178._8_4_ = fVar222 * auVar75._8_4_;
        auVar178._12_4_ = fVar223 * auVar75._12_4_;
        auVar194._0_4_ = fVar209 * auVar55._0_4_;
        auVar194._4_4_ = fVar221 * auVar55._4_4_;
        auVar194._8_4_ = fVar222 * auVar55._8_4_;
        auVar194._12_4_ = fVar223 * auVar55._12_4_;
        auVar75 = vminps_avx(auVar249,auVar240);
        auVar55 = vminps_avx(auVar178,auVar194);
        auVar56 = vminps_avx(auVar75,auVar55);
        auVar75 = vmaxps_avx(auVar240,auVar249);
        auVar55 = vmaxps_avx(auVar194,auVar178);
        auVar55 = vmaxps_avx(auVar55,auVar75);
        auVar59 = vminps_avx512vl(auVar257,auVar57);
        auVar75 = vminps_avx(auVar219,auVar230);
        auVar75 = vminps_avx(auVar59,auVar75);
        auVar75 = vhaddps_avx(auVar56,auVar75);
        auVar57 = vmaxps_avx512vl(auVar57,auVar257);
        auVar56 = vmaxps_avx(auVar230,auVar219);
        auVar56 = vmaxps_avx(auVar56,auVar57);
        auVar55 = vhaddps_avx(auVar55,auVar56);
        auVar75 = vshufps_avx(auVar75,auVar75,0xe8);
        auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
        auVar179._0_4_ = auVar75._0_4_ + auVar63._0_4_;
        auVar179._4_4_ = auVar75._4_4_ + auVar63._4_4_;
        auVar179._8_4_ = auVar75._8_4_ + auVar63._8_4_;
        auVar179._12_4_ = auVar75._12_4_ + auVar63._12_4_;
        auVar195._0_4_ = auVar55._0_4_ + auVar63._0_4_;
        auVar195._4_4_ = auVar55._4_4_ + auVar63._4_4_;
        auVar195._8_4_ = auVar55._8_4_ + auVar63._8_4_;
        auVar195._12_4_ = auVar55._12_4_ + auVar63._12_4_;
        auVar75 = vmaxps_avx(auVar64,auVar179);
        auVar55 = vminps_avx(auVar195,auVar58);
        uVar50 = vcmpps_avx512vl(auVar55,auVar75,1);
        local_470 = vinsertps_avx(auVar71,auVar162,0x10);
        auVar264 = ZEXT1664(local_470);
        if ((uVar50 & 3) == 0) {
          vucomiss_avx512f(auVar70);
          if ((uint)uVar44 < 4 && (uVar7 == 0 || lVar48 == 0)) {
            bVar14 = false;
          }
          else {
            lVar48 = 200;
            do {
              auVar75 = vsubss_avx512f(auVar72,auVar63);
              fVar222 = auVar75._0_4_;
              fVar209 = fVar222 * fVar222 * fVar222;
              fVar223 = auVar63._0_4_;
              fVar221 = fVar223 * 3.0 * fVar222 * fVar222;
              fVar222 = fVar222 * fVar223 * fVar223 * 3.0;
              auVar159._4_4_ = fVar209;
              auVar159._0_4_ = fVar209;
              auVar159._8_4_ = fVar209;
              auVar159._12_4_ = fVar209;
              auVar150._4_4_ = fVar221;
              auVar150._0_4_ = fVar221;
              auVar150._8_4_ = fVar221;
              auVar150._12_4_ = fVar221;
              auVar122._4_4_ = fVar222;
              auVar122._0_4_ = fVar222;
              auVar122._8_4_ = fVar222;
              auVar122._12_4_ = fVar222;
              fVar223 = fVar223 * fVar223 * fVar223;
              auVar166._0_4_ = (float)local_450._0_4_ * fVar223;
              auVar166._4_4_ = (float)local_450._4_4_ * fVar223;
              auVar166._8_4_ = fStack_448 * fVar223;
              auVar166._12_4_ = fStack_444 * fVar223;
              auVar75 = vfmadd231ps_fma(auVar166,auVar68,auVar122);
              auVar75 = vfmadd231ps_avx512vl(auVar75,auVar65,auVar150);
              auVar75 = vfmadd231ps_avx512vl(auVar75,auVar69,auVar159);
              auVar123._8_8_ = auVar75._0_8_;
              auVar123._0_8_ = auVar75._0_8_;
              auVar75 = vshufpd_avx(auVar75,auVar75,3);
              auVar55 = vshufps_avx(auVar63,auVar63,0x55);
              auVar75 = vsubps_avx(auVar75,auVar123);
              auVar55 = vfmadd213ps_fma(auVar75,auVar55,auVar123);
              fVar209 = auVar55._0_4_;
              auVar75 = vshufps_avx(auVar55,auVar55,0x55);
              auVar124._0_4_ = auVar67._0_4_ * fVar209 + fVar111 * auVar75._0_4_;
              auVar124._4_4_ = auVar67._4_4_ * fVar209 + auVar73._4_4_ * auVar75._4_4_;
              auVar124._8_4_ = auVar67._8_4_ * fVar209 + auVar73._8_4_ * auVar75._8_4_;
              auVar124._12_4_ = auVar67._12_4_ * fVar209 + auVar73._12_4_ * auVar75._12_4_;
              auVar63 = vsubps_avx(auVar63,auVar124);
              auVar75 = vandps_avx512vl(auVar55,auVar270._0_16_);
              auVar55 = vprolq_avx512vl(auVar75,0x20);
              auVar75 = vmaxss_avx(auVar55,auVar75);
              bVar21 = auVar75._0_4_ <= (float)local_460._0_4_;
              if (auVar75._0_4_ < (float)local_460._0_4_) {
                auVar67 = vucomiss_avx512f(auVar53);
                if (bVar21) {
                  auVar72 = vucomiss_avx512f(auVar67);
                  auVar269 = ZEXT1664(auVar72);
                  if (bVar21) {
                    vmovshdup_avx(auVar67);
                    auVar72 = vucomiss_avx512f(auVar53);
                    if (bVar21) {
                      auVar73 = vucomiss_avx512f(auVar72);
                      auVar269 = ZEXT1664(auVar73);
                      if (bVar21) {
                        auVar75 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar61 = vinsertps_avx(auVar75,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar75 = vdpps_avx(auVar61,local_2b0,0x7f);
                        auVar55 = vdpps_avx(auVar61,local_2c0,0x7f);
                        auVar58 = vdpps_avx(auVar61,local_2d0,0x7f);
                        auVar56 = vdpps_avx(auVar61,local_2e0,0x7f);
                        auVar57 = vdpps_avx(auVar61,local_2f0,0x7f);
                        auVar59 = vdpps_avx(auVar61,local_300,0x7f);
                        auVar60 = vdpps_avx(auVar61,local_310,0x7f);
                        auVar61 = vdpps_avx(auVar61,local_320,0x7f);
                        auVar62 = vsubss_avx512f(auVar73,auVar72);
                        fVar222 = auVar72._0_4_;
                        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar57._0_4_)),auVar62,
                                                  auVar75);
                        auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar222)),auVar62,
                                                  auVar55);
                        auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar222)),auVar62,
                                                  auVar58);
                        auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar61._0_4_)),auVar62,
                                                  auVar56);
                        auVar73 = vsubss_avx512f(auVar73,auVar67);
                        auVar180._0_4_ = auVar73._0_4_;
                        fVar111 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                        local_120 = auVar67._0_4_;
                        fVar209 = local_120 * 3.0 * auVar180._0_4_ * auVar180._0_4_;
                        fVar221 = auVar180._0_4_ * local_120 * local_120 * 3.0;
                        fVar224 = local_120 * local_120 * local_120;
                        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar58._0_4_)),
                                                  ZEXT416((uint)fVar221),auVar55);
                        auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar209),auVar75);
                        auVar72 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar111),auVar72);
                        fVar223 = auVar72._0_4_;
                        if (fVar137 <= fVar223) {
                          auVar72 = vucomiss_avx512f(auVar72);
                          if (fVar137 <= fVar223) {
                            auVar73 = vshufps_avx(auVar67,auVar67,0x55);
                            auVar58 = vsubps_avx512vl(auVar113,auVar73);
                            fVar136 = auVar73._0_4_;
                            auVar220._0_4_ = fVar136 * (float)local_370._0_4_;
                            fVar201 = auVar73._4_4_;
                            auVar220._4_4_ = fVar201 * (float)local_370._4_4_;
                            fVar202 = auVar73._8_4_;
                            auVar220._8_4_ = fVar202 * fStack_368;
                            fVar203 = auVar73._12_4_;
                            auVar220._12_4_ = fVar203 * fStack_364;
                            auVar231._0_4_ = fVar136 * (float)local_380._0_4_;
                            auVar231._4_4_ = fVar201 * (float)local_380._4_4_;
                            auVar231._8_4_ = fVar202 * fStack_378;
                            auVar231._12_4_ = fVar203 * fStack_374;
                            auVar241._0_4_ = fVar136 * (float)local_390._0_4_;
                            auVar241._4_4_ = fVar201 * (float)local_390._4_4_;
                            auVar241._8_4_ = fVar202 * fStack_388;
                            auVar241._12_4_ = fVar203 * fStack_384;
                            auVar196._0_4_ = fVar136 * (float)local_3a0._0_4_;
                            auVar196._4_4_ = fVar201 * (float)local_3a0._4_4_;
                            auVar196._8_4_ = fVar202 * fStack_398;
                            auVar196._12_4_ = fVar203 * fStack_394;
                            auVar73 = vfmadd231ps_fma(auVar220,auVar58,local_330);
                            auVar75 = vfmadd231ps_fma(auVar231,auVar58,local_340);
                            auVar55 = vfmadd231ps_fma(auVar241,auVar58,local_350);
                            auVar58 = vfmadd231ps_fma(auVar196,auVar58,local_360);
                            auVar73 = vsubps_avx(auVar75,auVar73);
                            auVar75 = vsubps_avx(auVar55,auVar75);
                            auVar55 = vsubps_avx(auVar58,auVar55);
                            auVar242._0_4_ = local_120 * auVar75._0_4_;
                            auVar242._4_4_ = local_120 * auVar75._4_4_;
                            auVar242._8_4_ = local_120 * auVar75._8_4_;
                            auVar242._12_4_ = local_120 * auVar75._12_4_;
                            auVar180._4_4_ = auVar180._0_4_;
                            auVar180._8_4_ = auVar180._0_4_;
                            auVar180._12_4_ = auVar180._0_4_;
                            auVar73 = vfmadd231ps_fma(auVar242,auVar180,auVar73);
                            auVar197._0_4_ = local_120 * auVar55._0_4_;
                            auVar197._4_4_ = local_120 * auVar55._4_4_;
                            auVar197._8_4_ = local_120 * auVar55._8_4_;
                            auVar197._12_4_ = local_120 * auVar55._12_4_;
                            auVar75 = vfmadd231ps_fma(auVar197,auVar180,auVar75);
                            auVar198._0_4_ = local_120 * auVar75._0_4_;
                            auVar198._4_4_ = local_120 * auVar75._4_4_;
                            auVar198._8_4_ = local_120 * auVar75._8_4_;
                            auVar198._12_4_ = local_120 * auVar75._12_4_;
                            auVar73 = vfmadd231ps_fma(auVar198,auVar180,auVar73);
                            auVar24._8_4_ = 0x40400000;
                            auVar24._0_8_ = 0x4040000040400000;
                            auVar24._12_4_ = 0x40400000;
                            auVar73 = vmulps_avx512vl(auVar73,auVar24);
                            pGVar8 = (context->scene->geometries).items[uVar51].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar167._0_4_ = fVar224 * (float)local_3e0._0_4_;
                              auVar167._4_4_ = fVar224 * (float)local_3e0._4_4_;
                              auVar167._8_4_ = fVar224 * fStack_3d8;
                              auVar167._12_4_ = fVar224 * fStack_3d4;
                              auVar160._4_4_ = fVar221;
                              auVar160._0_4_ = fVar221;
                              auVar160._8_4_ = fVar221;
                              auVar160._12_4_ = fVar221;
                              auVar75 = vfmadd132ps_fma(auVar160,auVar167,local_3d0);
                              auVar151._4_4_ = fVar209;
                              auVar151._0_4_ = fVar209;
                              auVar151._8_4_ = fVar209;
                              auVar151._12_4_ = fVar209;
                              auVar75 = vfmadd132ps_fma(auVar151,auVar75,local_3c0);
                              auVar143._4_4_ = fVar111;
                              auVar143._0_4_ = fVar111;
                              auVar143._8_4_ = fVar111;
                              auVar143._12_4_ = fVar111;
                              auVar58 = vfmadd132ps_fma(auVar143,auVar75,local_3b0);
                              auVar75 = vshufps_avx(auVar58,auVar58,0xc9);
                              auVar55 = vshufps_avx(auVar73,auVar73,0xc9);
                              auVar144._0_4_ = auVar58._0_4_ * auVar55._0_4_;
                              auVar144._4_4_ = auVar58._4_4_ * auVar55._4_4_;
                              auVar144._8_4_ = auVar58._8_4_ * auVar55._8_4_;
                              auVar144._12_4_ = auVar58._12_4_ * auVar55._12_4_;
                              auVar73 = vfmsub231ps_fma(auVar144,auVar73,auVar75);
                              local_140 = auVar73._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar223;
                                uVar112 = vextractps_avx(auVar73,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar112;
                                uVar112 = vextractps_avx(auVar73,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar112;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar222;
                                *(uint *)(ray + k * 4 + 0x220) = uVar6;
                                *(uint *)(ray + k * 4 + 0x240) = uVar51;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar154._8_4_ = 1;
                                auVar154._0_8_ = 0x100000001;
                                auVar154._12_4_ = 1;
                                auVar154._16_4_ = 1;
                                auVar154._20_4_ = 1;
                                auVar154._24_4_ = 1;
                                auVar154._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar154,ZEXT1632(auVar67));
                                auVar81 = vpermps_avx2(auVar154,ZEXT1632(auVar73));
                                auVar161._8_4_ = 2;
                                auVar161._0_8_ = 0x200000002;
                                auVar161._12_4_ = 2;
                                auVar161._16_4_ = 2;
                                auVar161._20_4_ = 2;
                                auVar161._24_4_ = 2;
                                auVar161._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar161,ZEXT1632(auVar73));
                                local_180[0] = (RTCHitN)auVar81[0];
                                local_180[1] = (RTCHitN)auVar81[1];
                                local_180[2] = (RTCHitN)auVar81[2];
                                local_180[3] = (RTCHitN)auVar81[3];
                                local_180[4] = (RTCHitN)auVar81[4];
                                local_180[5] = (RTCHitN)auVar81[5];
                                local_180[6] = (RTCHitN)auVar81[6];
                                local_180[7] = (RTCHitN)auVar81[7];
                                local_180[8] = (RTCHitN)auVar81[8];
                                local_180[9] = (RTCHitN)auVar81[9];
                                local_180[10] = (RTCHitN)auVar81[10];
                                local_180[0xb] = (RTCHitN)auVar81[0xb];
                                local_180[0xc] = (RTCHitN)auVar81[0xc];
                                local_180[0xd] = (RTCHitN)auVar81[0xd];
                                local_180[0xe] = (RTCHitN)auVar81[0xe];
                                local_180[0xf] = (RTCHitN)auVar81[0xf];
                                local_180[0x10] = (RTCHitN)auVar81[0x10];
                                local_180[0x11] = (RTCHitN)auVar81[0x11];
                                local_180[0x12] = (RTCHitN)auVar81[0x12];
                                local_180[0x13] = (RTCHitN)auVar81[0x13];
                                local_180[0x14] = (RTCHitN)auVar81[0x14];
                                local_180[0x15] = (RTCHitN)auVar81[0x15];
                                local_180[0x16] = (RTCHitN)auVar81[0x16];
                                local_180[0x17] = (RTCHitN)auVar81[0x17];
                                local_180[0x18] = (RTCHitN)auVar81[0x18];
                                local_180[0x19] = (RTCHitN)auVar81[0x19];
                                local_180[0x1a] = (RTCHitN)auVar81[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar81[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar81[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar81[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar81[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar81[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_240._0_8_;
                                uStack_d8 = local_240._8_8_;
                                uStack_d0 = local_240._16_8_;
                                uStack_c8 = local_240._24_8_;
                                local_c0 = local_220;
                                vpcmpeqd_avx2(local_220,local_220);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar223;
                                local_400 = local_260._0_8_;
                                uStack_3f8 = local_260._8_8_;
                                uStack_3f0 = local_260._16_8_;
                                uStack_3e8 = local_260._24_8_;
                                local_4a0.valid = (int *)&local_400;
                                local_4a0.geometryUserPtr = pGVar8->userPtr;
                                local_4a0.context = context->user;
                                local_4a0.hit = local_180;
                                local_4a0.N = 8;
                                local_4a0.ray = (RTCRayN *)ray;
                                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar8->intersectionFilterN)(&local_4a0);
                                  auVar264 = ZEXT1664(local_470);
                                  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar267 = ZEXT3264(auVar81);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar270 = ZEXT1664(auVar67);
                                  auVar269 = ZEXT464(0x3f800000);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar271 = ZEXT1664(auVar67);
                                  auVar53 = vxorps_avx512vl(auVar53,auVar53);
                                  auVar266 = ZEXT1664(auVar53);
                                }
                                auVar53 = auVar266._0_16_;
                                auVar40._8_8_ = uStack_3f8;
                                auVar40._0_8_ = local_400;
                                auVar40._16_8_ = uStack_3f0;
                                auVar40._24_8_ = uStack_3e8;
                                if (auVar40 == (undefined1  [32])0x0) {
LAB_01ec33ce:
                                  *(int *)(ray + k * 4 + 0x100) = auVar72._0_4_;
                                }
                                else {
                                  p_Var13 = context->args->filter;
                                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var13)(&local_4a0);
                                    auVar264 = ZEXT1664(local_470);
                                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar267 = ZEXT3264(auVar81);
                                    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar270 = ZEXT1664(auVar67);
                                    auVar269 = ZEXT464(0x3f800000);
                                    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar271 = ZEXT1664(auVar67);
                                    auVar53 = vxorps_avx512vl(auVar53,auVar53);
                                    auVar266 = ZEXT1664(auVar53);
                                  }
                                  auVar41._8_8_ = uStack_3f8;
                                  auVar41._0_8_ = local_400;
                                  auVar41._16_8_ = uStack_3f0;
                                  auVar41._24_8_ = uStack_3e8;
                                  if (auVar41 == (undefined1  [32])0x0) goto LAB_01ec33ce;
                                  uVar50 = vptestmd_avx512vl(auVar41,auVar41);
                                  iVar110 = *(int *)(local_4a0.hit + 4);
                                  iVar265 = *(int *)(local_4a0.hit + 8);
                                  iVar35 = *(int *)(local_4a0.hit + 0xc);
                                  iVar36 = *(int *)(local_4a0.hit + 0x10);
                                  iVar37 = *(int *)(local_4a0.hit + 0x14);
                                  iVar38 = *(int *)(local_4a0.hit + 0x18);
                                  iVar39 = *(int *)(local_4a0.hit + 0x1c);
                                  bVar42 = (byte)uVar50;
                                  bVar21 = (bool)((byte)(uVar50 >> 1) & 1);
                                  bVar15 = (bool)((byte)(uVar50 >> 2) & 1);
                                  bVar16 = (bool)((byte)(uVar50 >> 3) & 1);
                                  bVar17 = (bool)((byte)(uVar50 >> 4) & 1);
                                  bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
                                  bVar19 = (bool)((byte)(uVar50 >> 6) & 1);
                                  bVar20 = SUB81(uVar50 >> 7,0);
                                  *(uint *)(local_4a0.ray + 0x180) =
                                       (uint)(bVar42 & 1) * *(int *)local_4a0.hit |
                                       (uint)!(bool)(bVar42 & 1) * *(int *)(local_4a0.ray + 0x180);
                                  *(uint *)(local_4a0.ray + 0x184) =
                                       (uint)bVar21 * iVar110 |
                                       (uint)!bVar21 * *(int *)(local_4a0.ray + 0x184);
                                  *(uint *)(local_4a0.ray + 0x188) =
                                       (uint)bVar15 * iVar265 |
                                       (uint)!bVar15 * *(int *)(local_4a0.ray + 0x188);
                                  *(uint *)(local_4a0.ray + 0x18c) =
                                       (uint)bVar16 * iVar35 |
                                       (uint)!bVar16 * *(int *)(local_4a0.ray + 0x18c);
                                  *(uint *)(local_4a0.ray + 400) =
                                       (uint)bVar17 * iVar36 |
                                       (uint)!bVar17 * *(int *)(local_4a0.ray + 400);
                                  *(uint *)(local_4a0.ray + 0x194) =
                                       (uint)bVar18 * iVar37 |
                                       (uint)!bVar18 * *(int *)(local_4a0.ray + 0x194);
                                  *(uint *)(local_4a0.ray + 0x198) =
                                       (uint)bVar19 * iVar38 |
                                       (uint)!bVar19 * *(int *)(local_4a0.ray + 0x198);
                                  *(uint *)(local_4a0.ray + 0x19c) =
                                       (uint)bVar20 * iVar39 |
                                       (uint)!bVar20 * *(int *)(local_4a0.ray + 0x19c);
                                  iVar110 = *(int *)(local_4a0.hit + 0x24);
                                  iVar265 = *(int *)(local_4a0.hit + 0x28);
                                  iVar35 = *(int *)(local_4a0.hit + 0x2c);
                                  iVar36 = *(int *)(local_4a0.hit + 0x30);
                                  iVar37 = *(int *)(local_4a0.hit + 0x34);
                                  iVar38 = *(int *)(local_4a0.hit + 0x38);
                                  iVar39 = *(int *)(local_4a0.hit + 0x3c);
                                  bVar21 = (bool)((byte)(uVar50 >> 1) & 1);
                                  bVar15 = (bool)((byte)(uVar50 >> 2) & 1);
                                  bVar16 = (bool)((byte)(uVar50 >> 3) & 1);
                                  bVar17 = (bool)((byte)(uVar50 >> 4) & 1);
                                  bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
                                  bVar19 = (bool)((byte)(uVar50 >> 6) & 1);
                                  bVar20 = SUB81(uVar50 >> 7,0);
                                  *(uint *)(local_4a0.ray + 0x1a0) =
                                       (uint)(bVar42 & 1) * *(int *)(local_4a0.hit + 0x20) |
                                       (uint)!(bool)(bVar42 & 1) * *(int *)(local_4a0.ray + 0x1a0);
                                  *(uint *)(local_4a0.ray + 0x1a4) =
                                       (uint)bVar21 * iVar110 |
                                       (uint)!bVar21 * *(int *)(local_4a0.ray + 0x1a4);
                                  *(uint *)(local_4a0.ray + 0x1a8) =
                                       (uint)bVar15 * iVar265 |
                                       (uint)!bVar15 * *(int *)(local_4a0.ray + 0x1a8);
                                  *(uint *)(local_4a0.ray + 0x1ac) =
                                       (uint)bVar16 * iVar35 |
                                       (uint)!bVar16 * *(int *)(local_4a0.ray + 0x1ac);
                                  *(uint *)(local_4a0.ray + 0x1b0) =
                                       (uint)bVar17 * iVar36 |
                                       (uint)!bVar17 * *(int *)(local_4a0.ray + 0x1b0);
                                  *(uint *)(local_4a0.ray + 0x1b4) =
                                       (uint)bVar18 * iVar37 |
                                       (uint)!bVar18 * *(int *)(local_4a0.ray + 0x1b4);
                                  *(uint *)(local_4a0.ray + 0x1b8) =
                                       (uint)bVar19 * iVar38 |
                                       (uint)!bVar19 * *(int *)(local_4a0.ray + 0x1b8);
                                  *(uint *)(local_4a0.ray + 0x1bc) =
                                       (uint)bVar20 * iVar39 |
                                       (uint)!bVar20 * *(int *)(local_4a0.ray + 0x1bc);
                                  iVar110 = *(int *)(local_4a0.hit + 0x44);
                                  iVar265 = *(int *)(local_4a0.hit + 0x48);
                                  iVar35 = *(int *)(local_4a0.hit + 0x4c);
                                  iVar36 = *(int *)(local_4a0.hit + 0x50);
                                  iVar37 = *(int *)(local_4a0.hit + 0x54);
                                  iVar38 = *(int *)(local_4a0.hit + 0x58);
                                  iVar39 = *(int *)(local_4a0.hit + 0x5c);
                                  bVar21 = (bool)((byte)(uVar50 >> 1) & 1);
                                  bVar15 = (bool)((byte)(uVar50 >> 2) & 1);
                                  bVar16 = (bool)((byte)(uVar50 >> 3) & 1);
                                  bVar17 = (bool)((byte)(uVar50 >> 4) & 1);
                                  bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
                                  bVar19 = (bool)((byte)(uVar50 >> 6) & 1);
                                  bVar20 = SUB81(uVar50 >> 7,0);
                                  *(uint *)(local_4a0.ray + 0x1c0) =
                                       (uint)(bVar42 & 1) * *(int *)(local_4a0.hit + 0x40) |
                                       (uint)!(bool)(bVar42 & 1) * *(int *)(local_4a0.ray + 0x1c0);
                                  *(uint *)(local_4a0.ray + 0x1c4) =
                                       (uint)bVar21 * iVar110 |
                                       (uint)!bVar21 * *(int *)(local_4a0.ray + 0x1c4);
                                  *(uint *)(local_4a0.ray + 0x1c8) =
                                       (uint)bVar15 * iVar265 |
                                       (uint)!bVar15 * *(int *)(local_4a0.ray + 0x1c8);
                                  *(uint *)(local_4a0.ray + 0x1cc) =
                                       (uint)bVar16 * iVar35 |
                                       (uint)!bVar16 * *(int *)(local_4a0.ray + 0x1cc);
                                  *(uint *)(local_4a0.ray + 0x1d0) =
                                       (uint)bVar17 * iVar36 |
                                       (uint)!bVar17 * *(int *)(local_4a0.ray + 0x1d0);
                                  *(uint *)(local_4a0.ray + 0x1d4) =
                                       (uint)bVar18 * iVar37 |
                                       (uint)!bVar18 * *(int *)(local_4a0.ray + 0x1d4);
                                  *(uint *)(local_4a0.ray + 0x1d8) =
                                       (uint)bVar19 * iVar38 |
                                       (uint)!bVar19 * *(int *)(local_4a0.ray + 0x1d8);
                                  *(uint *)(local_4a0.ray + 0x1dc) =
                                       (uint)bVar20 * iVar39 |
                                       (uint)!bVar20 * *(int *)(local_4a0.ray + 0x1dc);
                                  iVar110 = *(int *)(local_4a0.hit + 100);
                                  iVar265 = *(int *)(local_4a0.hit + 0x68);
                                  iVar35 = *(int *)(local_4a0.hit + 0x6c);
                                  iVar36 = *(int *)(local_4a0.hit + 0x70);
                                  iVar37 = *(int *)(local_4a0.hit + 0x74);
                                  iVar38 = *(int *)(local_4a0.hit + 0x78);
                                  iVar39 = *(int *)(local_4a0.hit + 0x7c);
                                  bVar21 = (bool)((byte)(uVar50 >> 1) & 1);
                                  bVar15 = (bool)((byte)(uVar50 >> 2) & 1);
                                  bVar16 = (bool)((byte)(uVar50 >> 3) & 1);
                                  bVar17 = (bool)((byte)(uVar50 >> 4) & 1);
                                  bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
                                  bVar19 = (bool)((byte)(uVar50 >> 6) & 1);
                                  bVar20 = SUB81(uVar50 >> 7,0);
                                  *(uint *)(local_4a0.ray + 0x1e0) =
                                       (uint)(bVar42 & 1) * *(int *)(local_4a0.hit + 0x60) |
                                       (uint)!(bool)(bVar42 & 1) * *(int *)(local_4a0.ray + 0x1e0);
                                  *(uint *)(local_4a0.ray + 0x1e4) =
                                       (uint)bVar21 * iVar110 |
                                       (uint)!bVar21 * *(int *)(local_4a0.ray + 0x1e4);
                                  *(uint *)(local_4a0.ray + 0x1e8) =
                                       (uint)bVar15 * iVar265 |
                                       (uint)!bVar15 * *(int *)(local_4a0.ray + 0x1e8);
                                  *(uint *)(local_4a0.ray + 0x1ec) =
                                       (uint)bVar16 * iVar35 |
                                       (uint)!bVar16 * *(int *)(local_4a0.ray + 0x1ec);
                                  *(uint *)(local_4a0.ray + 0x1f0) =
                                       (uint)bVar17 * iVar36 |
                                       (uint)!bVar17 * *(int *)(local_4a0.ray + 0x1f0);
                                  *(uint *)(local_4a0.ray + 500) =
                                       (uint)bVar18 * iVar37 |
                                       (uint)!bVar18 * *(int *)(local_4a0.ray + 500);
                                  *(uint *)(local_4a0.ray + 0x1f8) =
                                       (uint)bVar19 * iVar38 |
                                       (uint)!bVar19 * *(int *)(local_4a0.ray + 0x1f8);
                                  *(uint *)(local_4a0.ray + 0x1fc) =
                                       (uint)bVar20 * iVar39 |
                                       (uint)!bVar20 * *(int *)(local_4a0.ray + 0x1fc);
                                  iVar110 = *(int *)(local_4a0.hit + 0x84);
                                  iVar265 = *(int *)(local_4a0.hit + 0x88);
                                  iVar35 = *(int *)(local_4a0.hit + 0x8c);
                                  iVar36 = *(int *)(local_4a0.hit + 0x90);
                                  iVar37 = *(int *)(local_4a0.hit + 0x94);
                                  iVar38 = *(int *)(local_4a0.hit + 0x98);
                                  iVar39 = *(int *)(local_4a0.hit + 0x9c);
                                  bVar21 = (bool)((byte)(uVar50 >> 1) & 1);
                                  bVar15 = (bool)((byte)(uVar50 >> 2) & 1);
                                  bVar16 = (bool)((byte)(uVar50 >> 3) & 1);
                                  bVar17 = (bool)((byte)(uVar50 >> 4) & 1);
                                  bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
                                  bVar19 = (bool)((byte)(uVar50 >> 6) & 1);
                                  bVar20 = SUB81(uVar50 >> 7,0);
                                  *(uint *)(local_4a0.ray + 0x200) =
                                       (uint)(bVar42 & 1) * *(int *)(local_4a0.hit + 0x80) |
                                       (uint)!(bool)(bVar42 & 1) * *(int *)(local_4a0.ray + 0x200);
                                  *(uint *)(local_4a0.ray + 0x204) =
                                       (uint)bVar21 * iVar110 |
                                       (uint)!bVar21 * *(int *)(local_4a0.ray + 0x204);
                                  *(uint *)(local_4a0.ray + 0x208) =
                                       (uint)bVar15 * iVar265 |
                                       (uint)!bVar15 * *(int *)(local_4a0.ray + 0x208);
                                  *(uint *)(local_4a0.ray + 0x20c) =
                                       (uint)bVar16 * iVar35 |
                                       (uint)!bVar16 * *(int *)(local_4a0.ray + 0x20c);
                                  *(uint *)(local_4a0.ray + 0x210) =
                                       (uint)bVar17 * iVar36 |
                                       (uint)!bVar17 * *(int *)(local_4a0.ray + 0x210);
                                  *(uint *)(local_4a0.ray + 0x214) =
                                       (uint)bVar18 * iVar37 |
                                       (uint)!bVar18 * *(int *)(local_4a0.ray + 0x214);
                                  *(uint *)(local_4a0.ray + 0x218) =
                                       (uint)bVar19 * iVar38 |
                                       (uint)!bVar19 * *(int *)(local_4a0.ray + 0x218);
                                  *(uint *)(local_4a0.ray + 0x21c) =
                                       (uint)bVar20 * iVar39 |
                                       (uint)!bVar20 * *(int *)(local_4a0.ray + 0x21c);
                                  auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4a0.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_4a0.ray + 0x220) = auVar81;
                                  auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4a0.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_4a0.ray + 0x240) = auVar81;
                                  auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4a0.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_4a0.ray + 0x260) = auVar81;
                                  auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4a0.hit + 0x100));
                                  *(undefined1 (*) [32])(local_4a0.ray + 0x280) = auVar81;
                                }
                                auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar268 = ZEXT1664(auVar53);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar48 = lVar48 + -1;
            } while (lVar48 != 0);
          }
        }
      }
    } while (bVar14);
    auVar53 = vinsertps_avx(auVar70,auVar66,0x10);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(3));
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }